

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_intersector.h
# Opt level: O1

void embree::avx2::CurveNiIntersectorK<4,4>::
     intersect_n<embree::avx2::OrientedCurve1IntersectorK<embree::BezierCurveT,4>,embree::avx2::Intersect1KEpilog1<4,true>>
               (Precalculations *pre,RayHitK<4> *ray,size_t k,RayQueryContext *context,
               Primitive *prim)

{
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar1;
  Primitive PVar2;
  uint uVar3;
  Geometry *pGVar4;
  RTCFilterFunctionN p_Var5;
  void *pvVar6;
  __int_type_conflict _Var7;
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [32];
  undefined1 auVar13 [32];
  undefined1 auVar14 [32];
  undefined1 auVar15 [32];
  undefined1 auVar16 [32];
  undefined1 auVar17 [32];
  undefined1 auVar18 [32];
  int iVar19;
  undefined1 auVar20 [32];
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  bool bVar42;
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  uint uVar50;
  uint uVar51;
  uint uVar52;
  ulong uVar53;
  long lVar55;
  byte bVar56;
  uint uVar57;
  ulong uVar58;
  ulong uVar59;
  float fVar60;
  vint4 bi_2;
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined4 uVar61;
  undefined1 auVar67 [16];
  float fVar62;
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [32];
  undefined8 extraout_XMM1_Qa;
  float fVar93;
  vint4 bi_1;
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  float fVar92;
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [32];
  undefined1 auVar90 [32];
  undefined1 extraout_var [56];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [32];
  undefined1 auVar103 [32];
  undefined1 auVar104 [32];
  vint4 ai_2;
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  undefined1 auVar113 [32];
  undefined1 auVar114 [32];
  vint4 ai;
  undefined1 auVar115 [16];
  undefined1 auVar116 [16];
  undefined1 auVar117 [16];
  undefined1 auVar118 [16];
  undefined1 auVar119 [16];
  undefined1 auVar120 [16];
  undefined1 auVar121 [16];
  undefined1 auVar122 [16];
  undefined1 auVar123 [16];
  undefined1 auVar124 [16];
  undefined1 auVar125 [16];
  undefined1 auVar126 [16];
  undefined1 auVar127 [16];
  undefined1 auVar128 [32];
  undefined1 auVar129 [32];
  float fVar130;
  float fVar145;
  float fVar146;
  vint4 bi;
  undefined1 auVar131 [16];
  undefined1 auVar132 [16];
  undefined1 auVar133 [16];
  undefined1 auVar134 [16];
  undefined1 auVar135 [16];
  undefined1 auVar136 [16];
  undefined1 auVar137 [16];
  float fVar147;
  undefined1 auVar138 [16];
  undefined1 auVar139 [16];
  undefined1 auVar140 [16];
  undefined1 auVar141 [16];
  undefined1 auVar142 [16];
  undefined1 auVar143 [16];
  float fVar148;
  float fVar149;
  float fVar150;
  undefined1 auVar144 [32];
  float fVar151;
  undefined8 uVar152;
  float fVar172;
  vfloat4 b0_1;
  undefined1 auVar153 [16];
  undefined1 auVar154 [16];
  float fVar170;
  float fVar173;
  undefined1 auVar155 [16];
  undefined1 auVar156 [16];
  undefined1 auVar157 [16];
  undefined1 auVar158 [16];
  undefined1 auVar159 [16];
  undefined1 auVar160 [16];
  undefined1 auVar161 [16];
  undefined1 auVar162 [16];
  undefined1 auVar163 [16];
  float fVar171;
  undefined1 auVar164 [16];
  undefined1 auVar165 [16];
  undefined1 auVar166 [16];
  float fVar174;
  float fVar175;
  float fVar176;
  undefined1 auVar167 [32];
  undefined1 auVar168 [32];
  undefined1 auVar169 [32];
  undefined1 auVar177 [16];
  undefined1 auVar178 [16];
  undefined1 auVar179 [16];
  undefined1 auVar180 [16];
  undefined1 auVar181 [16];
  undefined1 auVar182 [16];
  undefined1 auVar183 [16];
  undefined1 auVar184 [16];
  undefined1 auVar185 [16];
  undefined1 auVar186 [16];
  undefined1 auVar187 [16];
  undefined1 auVar188 [16];
  undefined1 auVar189 [16];
  undefined1 auVar190 [32];
  vint4 ai_1;
  undefined1 auVar191 [16];
  undefined1 auVar192 [16];
  undefined1 auVar193 [16];
  undefined1 auVar194 [16];
  undefined1 auVar195 [16];
  undefined1 auVar196 [16];
  undefined1 auVar197 [16];
  undefined1 auVar198 [16];
  undefined1 auVar199 [16];
  undefined1 auVar200 [16];
  undefined1 auVar201 [16];
  undefined1 auVar202 [16];
  undefined1 auVar203 [16];
  undefined1 auVar204 [16];
  undefined1 auVar205 [32];
  vfloat4 a0_2;
  undefined1 auVar206 [16];
  undefined1 auVar207 [16];
  undefined1 auVar208 [16];
  undefined1 auVar209 [16];
  undefined1 auVar210 [16];
  undefined1 auVar211 [16];
  undefined1 auVar212 [16];
  undefined1 auVar213 [16];
  undefined1 auVar214 [32];
  vfloat4 a0_3;
  undefined1 auVar215 [16];
  undefined1 auVar216 [16];
  undefined1 auVar217 [16];
  undefined1 auVar218 [16];
  undefined1 auVar219 [16];
  undefined1 auVar220 [16];
  undefined1 auVar221 [16];
  undefined1 auVar222 [16];
  undefined1 auVar223 [16];
  float fVar224;
  float fVar225;
  float fVar226;
  undefined1 auVar227 [16];
  undefined1 auVar228 [16];
  undefined1 auVar229 [16];
  undefined1 auVar230 [16];
  undefined1 auVar231 [16];
  undefined1 auVar232 [16];
  undefined1 auVar233 [16];
  undefined1 auVar234 [32];
  float fVar235;
  float fVar246;
  float fVar247;
  vfloat4 a0_1;
  undefined1 auVar236 [16];
  float fVar248;
  undefined1 auVar237 [16];
  undefined1 auVar238 [16];
  undefined1 auVar239 [16];
  undefined1 auVar240 [16];
  undefined1 auVar241 [16];
  undefined1 auVar242 [16];
  undefined1 auVar243 [32];
  undefined1 auVar244 [32];
  undefined1 auVar245 [32];
  vfloat4 a0;
  undefined1 auVar249 [16];
  undefined1 auVar250 [16];
  undefined1 auVar251 [16];
  undefined1 auVar252 [16];
  undefined1 auVar253 [16];
  undefined1 auVar254 [16];
  undefined1 auVar255 [16];
  undefined1 auVar256 [16];
  undefined1 auVar257 [16];
  undefined1 auVar258 [32];
  undefined1 auVar259 [32];
  undefined1 auVar260 [16];
  undefined1 auVar261 [16];
  undefined1 auVar262 [16];
  undefined1 auVar263 [16];
  undefined1 auVar264 [16];
  undefined1 auVar265 [16];
  undefined1 auVar266 [32];
  undefined1 auVar267 [32];
  undefined1 auVar268 [32];
  undefined1 auVar270 [16];
  undefined1 auVar271 [16];
  undefined1 auVar272 [16];
  undefined1 auVar269 [16];
  undefined1 auVar273 [32];
  RTCFilterFunctionNArguments args;
  uint mask_stack [4];
  BBox1f cu_stack [4];
  BBox1f cv_stack [4];
  undefined1 local_678 [8];
  float fStack_670;
  float fStack_66c;
  float local_608;
  float fStack_604;
  undefined1 local_5b8 [8];
  undefined8 uStack_5b0;
  undefined8 uStack_5a8;
  undefined8 uStack_5a0;
  undefined1 local_598 [8];
  float fStack_590;
  float fStack_58c;
  float fStack_588;
  float fStack_584;
  float fStack_580;
  float fStack_57c;
  undefined8 local_558;
  undefined8 uStack_550;
  undefined8 *local_540;
  RTCFilterFunctionNArguments local_538;
  undefined1 local_508 [8];
  float fStack_500;
  float fStack_4fc;
  undefined1 local_4f8 [8];
  float fStack_4f0;
  float fStack_4ec;
  undefined1 local_4e8 [16];
  undefined1 local_4d8 [16];
  undefined1 local_4c8 [8];
  float fStack_4c0;
  float fStack_4bc;
  undefined1 local_4b8 [16];
  undefined1 local_4a8 [8];
  float fStack_4a0;
  float fStack_49c;
  undefined1 local_498 [16];
  undefined1 local_488 [16];
  undefined1 local_478 [16];
  undefined1 local_468 [8];
  float fStack_460;
  float fStack_45c;
  undefined1 local_458 [8];
  float fStack_450;
  float fStack_44c;
  undefined1 local_448 [8];
  float fStack_440;
  float fStack_43c;
  undefined1 local_438 [8];
  float fStack_430;
  float fStack_42c;
  undefined1 local_428 [8];
  float fStack_420;
  float fStack_41c;
  undefined1 local_418 [16];
  undefined1 local_408 [16];
  undefined1 local_3f8 [16];
  undefined1 local_3e8 [16];
  uint auStack_3d8 [4];
  uint local_3c8;
  uint uStack_3c4;
  uint uStack_3c0;
  uint uStack_3bc;
  uint local_3b8;
  uint uStack_3b4;
  uint uStack_3b0;
  uint uStack_3ac;
  undefined1 local_3a8 [16];
  undefined1 local_398 [8];
  float fStack_390;
  float fStack_38c;
  undefined1 local_388 [16];
  undefined1 local_378 [16];
  undefined1 local_368 [16];
  undefined1 local_358 [16];
  undefined1 local_348 [16];
  undefined1 local_338 [16];
  undefined1 local_328 [16];
  undefined1 local_318 [16];
  undefined1 local_308 [16];
  undefined1 local_2f8 [16];
  undefined1 local_2e8 [16];
  undefined1 local_2d8 [16];
  undefined1 local_2c8 [16];
  undefined1 local_2b8 [16];
  undefined1 local_2a8 [32];
  undefined1 local_288 [32];
  uint uStack_268;
  float afStack_264 [7];
  RTCHitN local_248 [16];
  undefined1 local_238 [16];
  undefined4 local_228;
  undefined4 uStack_224;
  undefined4 uStack_220;
  undefined4 uStack_21c;
  float local_218;
  float fStack_214;
  float fStack_210;
  float fStack_20c;
  undefined1 local_208 [16];
  undefined8 local_1f8;
  undefined8 uStack_1f0;
  undefined1 local_1e8 [16];
  uint local_1d8;
  uint uStack_1d4;
  uint uStack_1d0;
  uint uStack_1cc;
  uint uStack_1c8;
  uint uStack_1c4;
  uint uStack_1c0;
  uint uStack_1bc;
  float local_1b8;
  float fStack_1b4;
  float fStack_1b0;
  float fStack_1ac;
  float fStack_1a8;
  float fStack_1a4;
  float fStack_1a0;
  float fStack_19c;
  float local_198;
  float fStack_194;
  float fStack_190;
  float fStack_18c;
  float fStack_188;
  float fStack_184;
  float fStack_180;
  float fStack_17c;
  undefined1 local_178 [32];
  float local_158;
  float fStack_154;
  float fStack_150;
  float fStack_14c;
  float fStack_148;
  float fStack_144;
  float fStack_140;
  float fStack_13c;
  undefined1 local_138 [32];
  undefined1 local_118 [32];
  undefined1 local_f8 [32];
  undefined1 local_d8 [32];
  undefined1 local_b8 [32];
  undefined1 local_98 [32];
  undefined1 local_78 [32];
  ulong auStack_58 [5];
  ulong uVar54;
  undefined1 auVar91 [64];
  undefined1 auVar112 [32];
  
  PVar2 = prim[1];
  uVar59 = (ulong)(byte)PVar2;
  fVar60 = *(float *)(prim + uVar59 * 0x19 + 0x12);
  auVar8 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x10)),0x10
                        );
  auVar8 = vinsertps_avx(auVar8,ZEXT416(*(uint *)(ray + k * 4 + 0x20)),0x20);
  auVar68 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4 + 0x40)),
                          ZEXT416(*(uint *)(ray + k * 4 + 0x50)),0x10);
  auVar68 = vinsertps_avx(auVar68,ZEXT416(*(uint *)(ray + k * 4 + 0x60)),0x20);
  auVar8 = vsubps_avx(auVar8,*(undefined1 (*) [16])(prim + uVar59 * 0x19 + 6));
  auVar120._0_4_ = fVar60 * auVar8._0_4_;
  auVar120._4_4_ = fVar60 * auVar8._4_4_;
  auVar120._8_4_ = fVar60 * auVar8._8_4_;
  auVar120._12_4_ = fVar60 * auVar8._12_4_;
  auVar131._0_4_ = fVar60 * auVar68._0_4_;
  auVar131._4_4_ = fVar60 * auVar68._4_4_;
  auVar131._8_4_ = fVar60 * auVar68._8_4_;
  auVar131._12_4_ = fVar60 * auVar68._12_4_;
  auVar8 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar59 * 4 + 6)));
  auVar8 = vcvtdq2ps_avx(auVar8);
  auVar68 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar59 * 5 + 6)));
  auVar68 = vcvtdq2ps_avx(auVar68);
  auVar264 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar59 * 6 + 6)));
  auVar264 = vcvtdq2ps_avx(auVar264);
  auVar9 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar59 * 0xb + 6)));
  auVar9 = vcvtdq2ps_avx(auVar9);
  auVar10 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + (ulong)((uint)(byte)PVar2 * 0xc) + 6)));
  auVar10 = vcvtdq2ps_avx(auVar10);
  auVar11 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + (uint)(byte)PVar2 * 0xc + uVar59 + 6)));
  auVar11 = vcvtdq2ps_avx(auVar11);
  uVar53 = (ulong)(uint)((int)(uVar59 * 9) * 2);
  auVar64 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar53 + 6)));
  auVar64 = vcvtdq2ps_avx(auVar64);
  auVar63 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar53 + uVar59 + 6)));
  auVar63 = vcvtdq2ps_avx(auVar63);
  uVar53 = (ulong)(uint)((int)(uVar59 * 5) << 2);
  auVar94 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar53 + 6)));
  auVar94 = vcvtdq2ps_avx(auVar94);
  auVar260._4_4_ = auVar131._0_4_;
  auVar260._0_4_ = auVar131._0_4_;
  auVar260._8_4_ = auVar131._0_4_;
  auVar260._12_4_ = auVar131._0_4_;
  auVar72 = vshufps_avx(auVar131,auVar131,0x55);
  auVar197 = vshufps_avx(auVar131,auVar131,0xaa);
  fVar60 = auVar197._0_4_;
  auVar227._0_4_ = fVar60 * auVar264._0_4_;
  fVar130 = auVar197._4_4_;
  auVar227._4_4_ = fVar130 * auVar264._4_4_;
  fVar145 = auVar197._8_4_;
  auVar227._8_4_ = fVar145 * auVar264._8_4_;
  fVar146 = auVar197._12_4_;
  auVar227._12_4_ = fVar146 * auVar264._12_4_;
  auVar215._0_4_ = auVar11._0_4_ * fVar60;
  auVar215._4_4_ = auVar11._4_4_ * fVar130;
  auVar215._8_4_ = auVar11._8_4_ * fVar145;
  auVar215._12_4_ = auVar11._12_4_ * fVar146;
  auVar191._0_4_ = auVar94._0_4_ * fVar60;
  auVar191._4_4_ = auVar94._4_4_ * fVar130;
  auVar191._8_4_ = auVar94._8_4_ * fVar145;
  auVar191._12_4_ = auVar94._12_4_ * fVar146;
  auVar197 = vfmadd231ps_fma(auVar227,auVar72,auVar68);
  auVar73 = vfmadd231ps_fma(auVar215,auVar72,auVar10);
  auVar72 = vfmadd231ps_fma(auVar191,auVar63,auVar72);
  auVar105 = vfmadd231ps_fma(auVar197,auVar260,auVar8);
  auVar73 = vfmadd231ps_fma(auVar73,auVar260,auVar9);
  auVar116 = vfmadd231ps_fma(auVar72,auVar64,auVar260);
  auVar261._4_4_ = auVar120._0_4_;
  auVar261._0_4_ = auVar120._0_4_;
  auVar261._8_4_ = auVar120._0_4_;
  auVar261._12_4_ = auVar120._0_4_;
  auVar72 = vshufps_avx(auVar120,auVar120,0x55);
  auVar197 = vshufps_avx(auVar120,auVar120,0xaa);
  fVar60 = auVar197._0_4_;
  auVar132._0_4_ = fVar60 * auVar264._0_4_;
  fVar130 = auVar197._4_4_;
  auVar132._4_4_ = fVar130 * auVar264._4_4_;
  fVar145 = auVar197._8_4_;
  auVar132._8_4_ = fVar145 * auVar264._8_4_;
  fVar146 = auVar197._12_4_;
  auVar132._12_4_ = fVar146 * auVar264._12_4_;
  auVar71._0_4_ = auVar11._0_4_ * fVar60;
  auVar71._4_4_ = auVar11._4_4_ * fVar130;
  auVar71._8_4_ = auVar11._8_4_ * fVar145;
  auVar71._12_4_ = auVar11._12_4_ * fVar146;
  auVar197._0_4_ = auVar94._0_4_ * fVar60;
  auVar197._4_4_ = auVar94._4_4_ * fVar130;
  auVar197._8_4_ = auVar94._8_4_ * fVar145;
  auVar197._12_4_ = auVar94._12_4_ * fVar146;
  auVar68 = vfmadd231ps_fma(auVar132,auVar72,auVar68);
  auVar264 = vfmadd231ps_fma(auVar71,auVar72,auVar10);
  auVar10 = vfmadd231ps_fma(auVar197,auVar72,auVar63);
  auVar11 = vfmadd231ps_fma(auVar68,auVar261,auVar8);
  auVar63 = vfmadd231ps_fma(auVar264,auVar261,auVar9);
  auVar94 = vfmadd231ps_fma(auVar10,auVar261,auVar64);
  auVar269._8_4_ = 0x7fffffff;
  auVar269._0_8_ = 0x7fffffff7fffffff;
  auVar269._12_4_ = 0x7fffffff;
  auVar8 = vandps_avx(auVar105,auVar269);
  auVar115._8_4_ = 0x219392ef;
  auVar115._0_8_ = 0x219392ef219392ef;
  auVar115._12_4_ = 0x219392ef;
  auVar8 = vcmpps_avx(auVar8,auVar115,1);
  auVar68 = vblendvps_avx(auVar105,auVar115,auVar8);
  auVar8 = vandps_avx(auVar73,auVar269);
  auVar8 = vcmpps_avx(auVar8,auVar115,1);
  auVar264 = vblendvps_avx(auVar73,auVar115,auVar8);
  auVar8 = vandps_avx(auVar116,auVar269);
  auVar8 = vcmpps_avx(auVar8,auVar115,1);
  auVar8 = vblendvps_avx(auVar116,auVar115,auVar8);
  auVar9 = vrcpps_avx(auVar68);
  auVar177._8_4_ = 0x3f800000;
  auVar177._0_8_ = &DAT_3f8000003f800000;
  auVar177._12_4_ = 0x3f800000;
  auVar68 = vfnmadd213ps_fma(auVar68,auVar9,auVar177);
  auVar9 = vfmadd132ps_fma(auVar68,auVar9,auVar9);
  auVar68 = vrcpps_avx(auVar264);
  auVar264 = vfnmadd213ps_fma(auVar264,auVar68,auVar177);
  auVar10 = vfmadd132ps_fma(auVar264,auVar68,auVar68);
  auVar68 = vrcpps_avx(auVar8);
  auVar8 = vfnmadd213ps_fma(auVar8,auVar68,auVar177);
  auVar64 = vfmadd132ps_fma(auVar8,auVar68,auVar68);
  auVar8._8_8_ = 0;
  auVar8._0_8_ = *(ulong *)(prim + uVar59 * 7 + 6);
  auVar8 = vpmovsxwd_avx(auVar8);
  auVar8 = vcvtdq2ps_avx(auVar8);
  auVar8 = vsubps_avx(auVar8,auVar11);
  auVar116._0_4_ = auVar9._0_4_ * auVar8._0_4_;
  auVar116._4_4_ = auVar9._4_4_ * auVar8._4_4_;
  auVar116._8_4_ = auVar9._8_4_ * auVar8._8_4_;
  auVar116._12_4_ = auVar9._12_4_ * auVar8._12_4_;
  auVar68._8_8_ = 0;
  auVar68._0_8_ = *(ulong *)(prim + uVar59 * 9 + 6);
  auVar8 = vpmovsxwd_avx(auVar68);
  auVar8 = vcvtdq2ps_avx(auVar8);
  auVar8 = vsubps_avx(auVar8,auVar11);
  auVar133._0_4_ = auVar9._0_4_ * auVar8._0_4_;
  auVar133._4_4_ = auVar9._4_4_ * auVar8._4_4_;
  auVar133._8_4_ = auVar9._8_4_ * auVar8._8_4_;
  auVar133._12_4_ = auVar9._12_4_ * auVar8._12_4_;
  auVar73._1_3_ = 0;
  auVar73[0] = PVar2;
  auVar264._8_8_ = 0;
  auVar264._0_8_ = *(ulong *)(prim + (ulong)(byte)PVar2 * 0x10 + 6);
  auVar68 = vpmovsxwd_avx(auVar264);
  auVar9._8_8_ = 0;
  auVar9._0_8_ = *(ulong *)(prim + (ulong)(byte)PVar2 * 0x10 + uVar59 * -2 + 6);
  auVar8 = vpmovsxwd_avx(auVar9);
  auVar8 = vcvtdq2ps_avx(auVar8);
  auVar8 = vsubps_avx(auVar8,auVar63);
  auVar192._0_4_ = auVar8._0_4_ * auVar10._0_4_;
  auVar192._4_4_ = auVar8._4_4_ * auVar10._4_4_;
  auVar192._8_4_ = auVar8._8_4_ * auVar10._8_4_;
  auVar192._12_4_ = auVar8._12_4_ * auVar10._12_4_;
  auVar8 = vcvtdq2ps_avx(auVar68);
  auVar8 = vsubps_avx(auVar8,auVar63);
  auVar72._0_4_ = auVar10._0_4_ * auVar8._0_4_;
  auVar72._4_4_ = auVar10._4_4_ * auVar8._4_4_;
  auVar72._8_4_ = auVar10._8_4_ * auVar8._8_4_;
  auVar72._12_4_ = auVar10._12_4_ * auVar8._12_4_;
  auVar10._8_8_ = 0;
  auVar10._0_8_ = *(ulong *)(prim + uVar53 + uVar59 + 6);
  auVar8 = vpmovsxwd_avx(auVar10);
  auVar8 = vcvtdq2ps_avx(auVar8);
  auVar8 = vsubps_avx(auVar8,auVar94);
  auVar105._0_4_ = auVar64._0_4_ * auVar8._0_4_;
  auVar105._4_4_ = auVar64._4_4_ * auVar8._4_4_;
  auVar105._8_4_ = auVar64._8_4_ * auVar8._8_4_;
  auVar105._12_4_ = auVar64._12_4_ * auVar8._12_4_;
  auVar11._8_8_ = 0;
  auVar11._0_8_ = *(ulong *)(prim + uVar59 * 0x17 + 6);
  auVar8 = vpmovsxwd_avx(auVar11);
  auVar8 = vcvtdq2ps_avx(auVar8);
  auVar8 = vsubps_avx(auVar8,auVar94);
  auVar63._0_4_ = auVar64._0_4_ * auVar8._0_4_;
  auVar63._4_4_ = auVar64._4_4_ * auVar8._4_4_;
  auVar63._8_4_ = auVar64._8_4_ * auVar8._8_4_;
  auVar63._12_4_ = auVar64._12_4_ * auVar8._12_4_;
  auVar8 = vpminsd_avx(auVar116,auVar133);
  auVar68 = vpminsd_avx(auVar192,auVar72);
  auVar8 = vmaxps_avx(auVar8,auVar68);
  auVar68 = vpminsd_avx(auVar105,auVar63);
  uVar61 = *(undefined4 *)(ray + k * 4 + 0x30);
  auVar206._4_4_ = uVar61;
  auVar206._0_4_ = uVar61;
  auVar206._8_4_ = uVar61;
  auVar206._12_4_ = uVar61;
  auVar68 = vmaxps_avx(auVar68,auVar206);
  auVar8 = vmaxps_avx(auVar8,auVar68);
  local_3a8._0_4_ = auVar8._0_4_ * 0.99999964;
  local_3a8._4_4_ = auVar8._4_4_ * 0.99999964;
  local_3a8._8_4_ = auVar8._8_4_ * 0.99999964;
  local_3a8._12_4_ = auVar8._12_4_ * 0.99999964;
  auVar8 = vpmaxsd_avx(auVar116,auVar133);
  auVar68 = vpmaxsd_avx(auVar192,auVar72);
  auVar8 = vminps_avx(auVar8,auVar68);
  auVar68 = vpmaxsd_avx(auVar105,auVar63);
  uVar61 = *(undefined4 *)(ray + k * 4 + 0x80);
  auVar94._4_4_ = uVar61;
  auVar94._0_4_ = uVar61;
  auVar94._8_4_ = uVar61;
  auVar94._12_4_ = uVar61;
  auVar68 = vminps_avx(auVar68,auVar94);
  auVar8 = vminps_avx(auVar8,auVar68);
  auVar64._0_4_ = auVar8._0_4_ * 1.0000004;
  auVar64._4_4_ = auVar8._4_4_ * 1.0000004;
  auVar64._8_4_ = auVar8._8_4_ * 1.0000004;
  auVar64._12_4_ = auVar8._12_4_ * 1.0000004;
  auVar73[4] = PVar2;
  auVar73._5_3_ = 0;
  auVar73[8] = PVar2;
  auVar73._9_3_ = 0;
  auVar73[0xc] = PVar2;
  auVar73._13_3_ = 0;
  auVar68 = vpcmpgtd_avx(auVar73,_DAT_01ff0cf0);
  auVar8 = vcmpps_avx(local_3a8,auVar64,2);
  auVar8 = vandps_avx(auVar8,auVar68);
  uVar50 = vmovmskps_avx(auVar8);
  if (uVar50 == 0) {
    return;
  }
  uVar50 = uVar50 & 0xff;
  auVar70._16_16_ = mm_lookupmask_ps._240_16_;
  auVar70._0_16_ = mm_lookupmask_ps._240_16_;
  local_288 = vblendps_avx(auVar70,ZEXT832(0) << 0x20,0x80);
  local_540 = (undefined8 *)(mm_lookupmask_ps + (long)(1 << ((uint)k & 0x1f)) * 0x10);
LAB_01654ef0:
  lVar55 = 0;
  uVar59 = (ulong)uVar50;
  for (uVar53 = uVar59; (uVar53 & 1) == 0; uVar53 = uVar53 >> 1 | 0x8000000000000000) {
    lVar55 = lVar55 + 1;
  }
  uVar50 = *(uint *)(prim + 2);
  uVar3 = *(uint *)(prim + lVar55 * 4 + 6);
  pGVar4 = (context->scene->geometries).items[uVar50].ptr;
  uVar53 = (ulong)*(uint *)(*(long *)&pGVar4->field_0x58 +
                           pGVar4[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>.
                           _M_i * (ulong)uVar3);
  p_Var5 = pGVar4[1].intersectionFilterN;
  pvVar6 = pGVar4[2].userPtr;
  _Var7 = pGVar4[2].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
  auVar8 = *(undefined1 (*) [16])(_Var7 + uVar53 * (long)pvVar6);
  auVar68 = *(undefined1 (*) [16])(_Var7 + (uVar53 + 1) * (long)pvVar6);
  auVar264 = *(undefined1 (*) [16])(_Var7 + (uVar53 + 2) * (long)pvVar6);
  auVar9 = *(undefined1 (*) [16])(_Var7 + (long)pvVar6 * (uVar53 + 3));
  lVar55 = *(long *)&pGVar4[1].time_range.upper;
  auVar10 = *(undefined1 (*) [16])(lVar55 + (long)p_Var5 * uVar53);
  auVar11 = *(undefined1 (*) [16])(lVar55 + (long)p_Var5 * (uVar53 + 1));
  auVar64 = *(undefined1 (*) [16])(lVar55 + (long)p_Var5 * (uVar53 + 2));
  uVar59 = uVar59 - 1 & uVar59;
  auVar63 = *(undefined1 (*) [16])(lVar55 + (long)p_Var5 * (uVar53 + 3));
  if (uVar59 != 0) {
    uVar58 = uVar59 - 1 & uVar59;
    for (uVar53 = uVar59; (uVar53 & 1) == 0; uVar53 = uVar53 >> 1 | 0x8000000000000000) {
    }
    if (uVar58 != 0) {
      for (; (uVar58 & 1) == 0; uVar58 = uVar58 >> 1 | 0x8000000000000000) {
      }
    }
  }
  auVar94 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x10)),
                          0x1c);
  auVar94 = vinsertps_avx(auVar94,ZEXT416(*(uint *)(ray + k * 4 + 0x20)),0x28);
  auVar65._12_4_ = 0;
  auVar65._0_12_ = ZEXT812(0);
  auVar65 = auVar65 << 0x20;
  auVar74._0_4_ = auVar63._0_4_ * 0.0;
  auVar74._4_4_ = auVar63._4_4_ * 0.0;
  auVar74._8_4_ = auVar63._8_4_ * 0.0;
  auVar74._12_4_ = auVar63._12_4_ * 0.0;
  auVar197 = vfmadd231ps_fma(auVar74,auVar64,auVar65);
  auVar72 = vfmadd213ps_fma(ZEXT816(0) << 0x40,auVar11,auVar197);
  local_678._0_4_ = auVar10._0_4_ + auVar72._0_4_;
  local_678._4_4_ = auVar10._4_4_ + auVar72._4_4_;
  fStack_670 = auVar10._8_4_ + auVar72._8_4_;
  fStack_66c = auVar10._12_4_ + auVar72._12_4_;
  auVar262._8_4_ = 0x40400000;
  auVar262._0_8_ = 0x4040000040400000;
  auVar262._12_4_ = 0x40400000;
  auVar72 = vfmadd231ps_fma(auVar197,auVar11,auVar262);
  auVar73 = vfnmadd231ps_fma(auVar72,auVar10,auVar262);
  auVar236._0_4_ = auVar9._0_4_ * 0.0;
  auVar236._4_4_ = auVar9._4_4_ * 0.0;
  auVar236._8_4_ = auVar9._8_4_ * 0.0;
  auVar236._12_4_ = auVar9._12_4_ * 0.0;
  auVar197 = vfmadd231ps_fma(auVar236,auVar264,auVar65);
  auVar72 = vfmadd213ps_fma(ZEXT816(0) << 0x40,auVar68,auVar197);
  auVar249._0_4_ = auVar8._0_4_ + auVar72._0_4_;
  auVar249._4_4_ = auVar8._4_4_ + auVar72._4_4_;
  auVar249._8_4_ = auVar8._8_4_ + auVar72._8_4_;
  auVar249._12_4_ = auVar8._12_4_ + auVar72._12_4_;
  auVar72 = vfmadd231ps_fma(auVar197,auVar68,auVar262);
  auVar197 = vfnmadd231ps_fma(auVar72,auVar8,auVar262);
  auVar72 = vfmadd213ps_fma(ZEXT816(0) << 0x20,auVar64,auVar63);
  auVar72 = vfmadd231ps_fma(auVar72,auVar11,auVar65);
  auVar72 = vfmadd231ps_fma(auVar72,auVar10,auVar65);
  auVar117._0_4_ = auVar63._0_4_ * 3.0;
  auVar117._4_4_ = auVar63._4_4_ * 3.0;
  auVar117._8_4_ = auVar63._8_4_ * 3.0;
  auVar117._12_4_ = auVar63._12_4_ * 3.0;
  auVar64 = vfnmadd231ps_fma(auVar117,auVar262,auVar64);
  auVar11 = vfmadd231ps_fma(auVar64,auVar65,auVar11);
  auVar64 = vfnmadd231ps_fma(auVar11,auVar65,auVar10);
  auVar10 = vfmadd213ps_fma(ZEXT816(0) << 0x20,auVar264,auVar9);
  auVar10 = vfmadd231ps_fma(auVar10,auVar68,auVar65);
  auVar10 = vfmadd231ps_fma(auVar10,auVar8,auVar65);
  auVar216._0_4_ = auVar9._0_4_ * 3.0;
  auVar216._4_4_ = auVar9._4_4_ * 3.0;
  auVar216._8_4_ = auVar9._8_4_ * 3.0;
  auVar216._12_4_ = auVar9._12_4_ * 3.0;
  auVar264 = vfnmadd231ps_fma(auVar216,auVar262,auVar264);
  auVar68 = vfmadd231ps_fma(auVar264,auVar65,auVar68);
  auVar11 = vfnmadd231ps_fma(auVar68,auVar65,auVar8);
  auVar8 = vshufps_avx(auVar73,auVar73,0xc9);
  auVar68 = vshufps_avx(auVar249,auVar249,0xc9);
  fVar147 = auVar73._0_4_;
  auVar153._0_4_ = fVar147 * auVar68._0_4_;
  fVar92 = auVar73._4_4_;
  auVar153._4_4_ = fVar92 * auVar68._4_4_;
  fVar93 = auVar73._8_4_;
  auVar153._8_4_ = fVar93 * auVar68._8_4_;
  fVar62 = auVar73._12_4_;
  auVar153._12_4_ = fVar62 * auVar68._12_4_;
  auVar68 = vfmsub231ps_fma(auVar153,auVar8,auVar249);
  auVar264 = vshufps_avx(auVar68,auVar68,0xc9);
  auVar68 = vshufps_avx(auVar197,auVar197,0xc9);
  auVar154._0_4_ = fVar147 * auVar68._0_4_;
  auVar154._4_4_ = fVar92 * auVar68._4_4_;
  auVar154._8_4_ = fVar93 * auVar68._8_4_;
  auVar154._12_4_ = fVar62 * auVar68._12_4_;
  auVar8 = vfmsub231ps_fma(auVar154,auVar8,auVar197);
  auVar9 = vshufps_avx(auVar8,auVar8,0xc9);
  auVar8 = vshufps_avx(auVar64,auVar64,0xc9);
  auVar68 = vshufps_avx(auVar10,auVar10,0xc9);
  fVar171 = auVar64._0_4_;
  auVar134._0_4_ = fVar171 * auVar68._0_4_;
  fVar148 = auVar64._4_4_;
  auVar134._4_4_ = fVar148 * auVar68._4_4_;
  fVar149 = auVar64._8_4_;
  auVar134._8_4_ = fVar149 * auVar68._8_4_;
  fVar150 = auVar64._12_4_;
  auVar134._12_4_ = fVar150 * auVar68._12_4_;
  auVar68 = vfmsub231ps_fma(auVar134,auVar8,auVar10);
  auVar10 = vshufps_avx(auVar68,auVar68,0xc9);
  auVar68 = vshufps_avx(auVar11,auVar11,0xc9);
  auVar178._0_4_ = fVar171 * auVar68._0_4_;
  auVar178._4_4_ = fVar148 * auVar68._4_4_;
  auVar178._8_4_ = fVar149 * auVar68._8_4_;
  auVar178._12_4_ = fVar150 * auVar68._12_4_;
  auVar68 = vfmsub231ps_fma(auVar178,auVar8,auVar11);
  auVar8 = vdpps_avx(auVar264,auVar264,0x7f);
  auVar11 = vshufps_avx(auVar68,auVar68,0xc9);
  fVar130 = auVar8._0_4_;
  auVar63 = ZEXT416((uint)fVar130);
  auVar68 = vrsqrtss_avx(auVar63,auVar63);
  fVar60 = auVar68._0_4_;
  auVar68 = vdpps_avx(auVar264,auVar9,0x7f);
  fVar145 = fVar60 * 1.5 - fVar130 * 0.5 * fVar60 * fVar60 * fVar60;
  fVar151 = auVar264._0_4_ * fVar145;
  fVar170 = auVar264._4_4_ * fVar145;
  fVar172 = auVar264._8_4_ * fVar145;
  fVar173 = auVar264._12_4_ * fVar145;
  auVar228._0_4_ = auVar9._0_4_ * fVar130;
  auVar228._4_4_ = auVar9._4_4_ * fVar130;
  auVar228._8_4_ = auVar9._8_4_ * fVar130;
  auVar228._12_4_ = auVar9._12_4_ * fVar130;
  fVar60 = auVar68._0_4_;
  auVar193._0_4_ = auVar264._0_4_ * fVar60;
  auVar193._4_4_ = auVar264._4_4_ * fVar60;
  auVar193._8_4_ = auVar264._8_4_ * fVar60;
  auVar193._12_4_ = auVar264._12_4_ * fVar60;
  auVar264 = vsubps_avx(auVar228,auVar193);
  auVar68 = vrcpss_avx(auVar63,auVar63);
  auVar8 = vfnmadd213ss_fma(auVar8,auVar68,SUB6416(ZEXT464(0x40000000),0));
  fVar60 = auVar68._0_4_ * auVar8._0_4_;
  auVar8 = vdpps_avx(auVar10,auVar10,0x7f);
  fVar130 = auVar8._0_4_;
  auVar63 = ZEXT416((uint)fVar130);
  auVar68 = vrsqrtss_avx(auVar63,auVar63);
  fVar146 = auVar68._0_4_;
  fVar146 = fVar146 * 1.5 - fVar130 * 0.5 * fVar146 * fVar146 * fVar146;
  fVar235 = fVar146 * auVar10._0_4_;
  fVar246 = fVar146 * auVar10._4_4_;
  fVar247 = fVar146 * auVar10._8_4_;
  fVar248 = fVar146 * auVar10._12_4_;
  auVar68 = vdpps_avx(auVar10,auVar11,0x7f);
  auVar179._0_4_ = fVar130 * auVar11._0_4_;
  auVar179._4_4_ = fVar130 * auVar11._4_4_;
  auVar179._8_4_ = fVar130 * auVar11._8_4_;
  auVar179._12_4_ = fVar130 * auVar11._12_4_;
  fVar130 = auVar68._0_4_;
  auVar135._0_4_ = fVar130 * auVar10._0_4_;
  auVar135._4_4_ = fVar130 * auVar10._4_4_;
  auVar135._8_4_ = fVar130 * auVar10._8_4_;
  auVar135._12_4_ = fVar130 * auVar10._12_4_;
  auVar9 = vsubps_avx(auVar179,auVar135);
  auVar68 = vrcpss_avx(auVar63,auVar63);
  auVar8 = vfnmadd213ss_fma(auVar8,auVar68,SUB6416(ZEXT464(0x40000000),0));
  fVar130 = auVar8._0_4_ * auVar68._0_4_;
  auVar8 = vshufps_avx(_local_678,_local_678,0xff);
  auVar207._0_4_ = auVar8._0_4_ * fVar151;
  auVar207._4_4_ = auVar8._4_4_ * fVar170;
  auVar207._8_4_ = auVar8._8_4_ * fVar172;
  auVar207._12_4_ = auVar8._12_4_ * fVar173;
  local_498 = vsubps_avx(_local_678,auVar207);
  auVar68 = vshufps_avx(auVar73,auVar73,0xff);
  auVar155._0_4_ = auVar68._0_4_ * fVar151 + fVar145 * auVar264._0_4_ * fVar60 * auVar8._0_4_;
  auVar155._4_4_ = auVar68._4_4_ * fVar170 + fVar145 * auVar264._4_4_ * fVar60 * auVar8._4_4_;
  auVar155._8_4_ = auVar68._8_4_ * fVar172 + fVar145 * auVar264._8_4_ * fVar60 * auVar8._8_4_;
  auVar155._12_4_ = auVar68._12_4_ * fVar173 + fVar145 * auVar264._12_4_ * fVar60 * auVar8._12_4_;
  auVar264 = vsubps_avx(auVar73,auVar155);
  local_4a8._0_4_ = auVar207._0_4_ + (float)local_678._0_4_;
  local_4a8._4_4_ = auVar207._4_4_ + (float)local_678._4_4_;
  fStack_4a0 = auVar207._8_4_ + fStack_670;
  fStack_49c = auVar207._12_4_ + fStack_66c;
  auVar8 = vshufps_avx(auVar72,auVar72,0xff);
  auVar95._0_4_ = fVar235 * auVar8._0_4_;
  auVar95._4_4_ = fVar246 * auVar8._4_4_;
  auVar95._8_4_ = fVar247 * auVar8._8_4_;
  auVar95._12_4_ = fVar248 * auVar8._12_4_;
  local_4b8 = vsubps_avx(auVar72,auVar95);
  auVar68 = vshufps_avx(auVar64,auVar64,0xff);
  auVar75._0_4_ = fVar235 * auVar68._0_4_ + auVar8._0_4_ * fVar146 * auVar9._0_4_ * fVar130;
  auVar75._4_4_ = fVar246 * auVar68._4_4_ + auVar8._4_4_ * fVar146 * auVar9._4_4_ * fVar130;
  auVar75._8_4_ = fVar247 * auVar68._8_4_ + auVar8._8_4_ * fVar146 * auVar9._8_4_ * fVar130;
  auVar75._12_4_ = fVar248 * auVar68._12_4_ + auVar8._12_4_ * fVar146 * auVar9._12_4_ * fVar130;
  auVar8 = vsubps_avx(auVar64,auVar75);
  local_4c8._0_4_ = auVar72._0_4_ + auVar95._0_4_;
  local_4c8._4_4_ = auVar72._4_4_ + auVar95._4_4_;
  fStack_4c0 = auVar72._8_4_ + auVar95._8_4_;
  fStack_4bc = auVar72._12_4_ + auVar95._12_4_;
  local_4d8._0_4_ = local_498._0_4_ + auVar264._0_4_ * 0.33333334;
  local_4d8._4_4_ = local_498._4_4_ + auVar264._4_4_ * 0.33333334;
  local_4d8._8_4_ = local_498._8_4_ + auVar264._8_4_ * 0.33333334;
  local_4d8._12_4_ = local_498._12_4_ + auVar264._12_4_ * 0.33333334;
  auVar76._0_4_ = auVar8._0_4_ * 0.33333334;
  auVar76._4_4_ = auVar8._4_4_ * 0.33333334;
  auVar76._8_4_ = auVar8._8_4_ * 0.33333334;
  auVar76._12_4_ = auVar8._12_4_ * 0.33333334;
  local_4e8 = vsubps_avx(local_4b8,auVar76);
  local_478 = vsubps_avx(local_498,auVar94);
  auVar8 = vshufps_avx(local_478,local_478,0x55);
  auVar68 = vshufps_avx(local_478,local_478,0xaa);
  aVar1 = pre->ray_space[k].vy.field_0;
  fVar60 = pre->ray_space[k].vz.field_0.m128[0];
  fVar130 = pre->ray_space[k].vz.field_0.m128[1];
  fVar145 = pre->ray_space[k].vz.field_0.m128[2];
  fVar146 = pre->ray_space[k].vz.field_0.m128[3];
  auVar77._0_4_ = fVar60 * auVar68._0_4_;
  auVar77._4_4_ = fVar130 * auVar68._4_4_;
  auVar77._8_4_ = fVar145 * auVar68._8_4_;
  auVar77._12_4_ = fVar146 * auVar68._12_4_;
  auVar264 = vfmadd231ps_fma(auVar77,(undefined1  [16])aVar1,auVar8);
  local_488 = vsubps_avx(local_4d8,auVar94);
  auVar8 = vshufps_avx(local_488,local_488,0x55);
  auVar68 = vshufps_avx(local_488,local_488,0xaa);
  auVar78._0_4_ = fVar60 * auVar68._0_4_;
  auVar78._4_4_ = fVar130 * auVar68._4_4_;
  auVar78._8_4_ = fVar145 * auVar68._8_4_;
  auVar78._12_4_ = fVar146 * auVar68._12_4_;
  auVar68 = vfmadd231ps_fma(auVar78,(undefined1  [16])aVar1,auVar8);
  local_2f8 = vsubps_avx(local_4e8,auVar94);
  auVar8 = vshufps_avx(local_2f8,local_2f8,0xaa);
  auVar237._0_4_ = fVar60 * auVar8._0_4_;
  auVar237._4_4_ = fVar130 * auVar8._4_4_;
  auVar237._8_4_ = fVar145 * auVar8._8_4_;
  auVar237._12_4_ = fVar146 * auVar8._12_4_;
  auVar8 = vshufps_avx(local_2f8,local_2f8,0x55);
  auVar9 = vfmadd231ps_fma(auVar237,(undefined1  [16])aVar1,auVar8);
  local_308 = vsubps_avx(local_4b8,auVar94);
  auVar8 = vshufps_avx(local_308,local_308,0xaa);
  auVar79._0_4_ = fVar60 * auVar8._0_4_;
  auVar79._4_4_ = fVar130 * auVar8._4_4_;
  auVar79._8_4_ = fVar145 * auVar8._8_4_;
  auVar79._12_4_ = fVar146 * auVar8._12_4_;
  auVar8 = vshufps_avx(local_308,local_308,0x55);
  auVar10 = vfmadd231ps_fma(auVar79,(undefined1  [16])aVar1,auVar8);
  local_318 = vsubps_avx(_local_4a8,auVar94);
  auVar8 = vshufps_avx(local_318,local_318,0xaa);
  auVar136._0_4_ = fVar60 * auVar8._0_4_;
  auVar136._4_4_ = fVar130 * auVar8._4_4_;
  auVar136._8_4_ = fVar145 * auVar8._8_4_;
  auVar136._12_4_ = fVar146 * auVar8._12_4_;
  auVar8 = vshufps_avx(local_318,local_318,0x55);
  auVar11 = vfmadd231ps_fma(auVar136,(undefined1  [16])aVar1,auVar8);
  local_4f8._0_4_ = (fVar147 + auVar155._0_4_) * 0.33333334 + (float)local_4a8._0_4_;
  local_4f8._4_4_ = (fVar92 + auVar155._4_4_) * 0.33333334 + (float)local_4a8._4_4_;
  fStack_4f0 = (fVar93 + auVar155._8_4_) * 0.33333334 + fStack_4a0;
  fStack_4ec = (fVar62 + auVar155._12_4_) * 0.33333334 + fStack_49c;
  local_328 = vsubps_avx(_local_4f8,auVar94);
  auVar8 = vshufps_avx(local_328,local_328,0xaa);
  auVar194._0_4_ = auVar8._0_4_ * fVar60;
  auVar194._4_4_ = auVar8._4_4_ * fVar130;
  auVar194._8_4_ = auVar8._8_4_ * fVar145;
  auVar194._12_4_ = auVar8._12_4_ * fVar146;
  auVar8 = vshufps_avx(local_328,local_328,0x55);
  auVar64 = vfmadd231ps_fma(auVar194,(undefined1  [16])aVar1,auVar8);
  auVar208._0_4_ = (fVar171 + auVar75._0_4_) * 0.33333334;
  auVar208._4_4_ = (fVar148 + auVar75._4_4_) * 0.33333334;
  auVar208._8_4_ = (fVar149 + auVar75._8_4_) * 0.33333334;
  auVar208._12_4_ = (fVar150 + auVar75._12_4_) * 0.33333334;
  _local_508 = vsubps_avx(_local_4c8,auVar208);
  local_338 = vsubps_avx(_local_508,auVar94);
  auVar8 = vshufps_avx(local_338,local_338,0xaa);
  auVar209._0_4_ = auVar8._0_4_ * fVar60;
  auVar209._4_4_ = auVar8._4_4_ * fVar130;
  auVar209._8_4_ = auVar8._8_4_ * fVar145;
  auVar209._12_4_ = auVar8._12_4_ * fVar146;
  auVar8 = vshufps_avx(local_338,local_338,0x55);
  auVar63 = vfmadd231ps_fma(auVar209,(undefined1  [16])aVar1,auVar8);
  local_348 = vsubps_avx(_local_4c8,auVar94);
  auVar8 = vshufps_avx(local_348,local_348,0xaa);
  auVar80._0_4_ = fVar60 * auVar8._0_4_;
  auVar80._4_4_ = fVar130 * auVar8._4_4_;
  auVar80._8_4_ = fVar145 * auVar8._8_4_;
  auVar80._12_4_ = fVar146 * auVar8._12_4_;
  auVar8 = vshufps_avx(local_348,local_348,0x55);
  auVar8 = vfmadd231ps_fma(auVar80,(undefined1  [16])aVar1,auVar8);
  auVar156._4_4_ = local_478._0_4_;
  auVar156._0_4_ = local_478._0_4_;
  auVar156._8_4_ = local_478._0_4_;
  auVar156._12_4_ = local_478._0_4_;
  aVar1 = pre->ray_space[k].vx.field_0;
  auVar94 = vfmadd231ps_fma(auVar264,(undefined1  [16])aVar1,auVar156);
  auVar157._4_4_ = local_488._0_4_;
  auVar157._0_4_ = local_488._0_4_;
  auVar157._8_4_ = local_488._0_4_;
  auVar157._12_4_ = local_488._0_4_;
  auVar72 = vfmadd231ps_fma(auVar68,(undefined1  [16])aVar1,auVar157);
  uVar61 = local_2f8._0_4_;
  auVar158._4_4_ = uVar61;
  auVar158._0_4_ = uVar61;
  auVar158._8_4_ = uVar61;
  auVar158._12_4_ = uVar61;
  auVar197 = vfmadd231ps_fma(auVar9,(undefined1  [16])aVar1,auVar158);
  uVar61 = local_308._0_4_;
  auVar159._4_4_ = uVar61;
  auVar159._0_4_ = uVar61;
  auVar159._8_4_ = uVar61;
  auVar159._12_4_ = uVar61;
  auVar73 = vfmadd231ps_fma(auVar10,(undefined1  [16])aVar1,auVar159);
  uVar61 = local_318._0_4_;
  auVar160._4_4_ = uVar61;
  auVar160._0_4_ = uVar61;
  auVar160._8_4_ = uVar61;
  auVar160._12_4_ = uVar61;
  auVar105 = vfmadd231ps_fma(auVar11,(undefined1  [16])aVar1,auVar160);
  uVar61 = local_328._0_4_;
  auVar161._4_4_ = uVar61;
  auVar161._0_4_ = uVar61;
  auVar161._8_4_ = uVar61;
  auVar161._12_4_ = uVar61;
  auVar64 = vfmadd231ps_fma(auVar64,(undefined1  [16])aVar1,auVar161);
  uVar61 = local_338._0_4_;
  auVar162._4_4_ = uVar61;
  auVar162._0_4_ = uVar61;
  auVar162._8_4_ = uVar61;
  auVar162._12_4_ = uVar61;
  auVar63 = vfmadd231ps_fma(auVar63,(undefined1  [16])aVar1,auVar162);
  uVar61 = local_348._0_4_;
  auVar163._4_4_ = uVar61;
  auVar163._0_4_ = uVar61;
  auVar163._8_4_ = uVar61;
  auVar163._12_4_ = uVar61;
  auVar116 = vfmadd231ps_fma(auVar8,(undefined1  [16])aVar1,auVar163);
  auVar9 = vmovlhps_avx(auVar94,auVar105);
  auVar10 = vmovlhps_avx(auVar72,auVar64);
  auVar11 = vmovlhps_avx(auVar197,auVar63);
  _local_468 = vmovlhps_avx(auVar73,auVar116);
  auVar8 = vminps_avx(auVar9,auVar10);
  auVar68 = vminps_avx(auVar11,_local_468);
  auVar264 = vminps_avx(auVar8,auVar68);
  auVar8 = vmaxps_avx(auVar9,auVar10);
  auVar68 = vmaxps_avx(auVar11,_local_468);
  auVar8 = vmaxps_avx(auVar8,auVar68);
  auVar68 = vshufpd_avx(auVar264,auVar264,3);
  auVar264 = vminps_avx(auVar264,auVar68);
  auVar68 = vshufpd_avx(auVar8,auVar8,3);
  auVar68 = vmaxps_avx(auVar8,auVar68);
  auVar8 = vandps_avx(auVar269,auVar264);
  auVar68 = vandps_avx(auVar269,auVar68);
  auVar8 = vmaxps_avx(auVar8,auVar68);
  auVar68 = vmovshdup_avx(auVar8);
  auVar8 = vmaxss_avx(auVar68,auVar8);
  local_198 = auVar8._0_4_ * 9.536743e-07;
  local_3e8._8_8_ = auVar94._0_8_;
  local_3e8._0_8_ = auVar94._0_8_;
  local_3f8._8_8_ = auVar72._0_8_;
  local_3f8._0_8_ = auVar72._0_8_;
  local_408._0_8_ = auVar197._0_8_;
  local_408._8_8_ = local_408._0_8_;
  local_678 = auVar73._0_8_;
  local_418._8_8_ = local_678;
  local_418._0_8_ = local_678;
  local_428 = auVar105._0_8_;
  register0x00001348 = local_428;
  register0x000013c8 = auVar64._0_8_;
  local_438 = auVar64._0_8_;
  register0x00001408 = auVar63._0_8_;
  local_448 = auVar63._0_8_;
  register0x00001448 = auVar116._0_8_;
  local_458 = auVar116._0_8_;
  local_2e8 = ZEXT416((uint)local_198);
  fStack_194 = local_198;
  fStack_190 = local_198;
  fStack_18c = local_198;
  fStack_188 = local_198;
  fStack_184 = local_198;
  fStack_180 = local_198;
  fStack_17c = local_198;
  local_1b8 = -local_198;
  fStack_1b4 = local_1b8;
  fStack_1b0 = local_1b8;
  fStack_1ac = local_1b8;
  fStack_1a8 = local_1b8;
  fStack_1a4 = local_1b8;
  fStack_1a0 = local_1b8;
  fStack_19c = local_1b8;
  local_3b8 = uVar50;
  uStack_3b4 = uVar50;
  uStack_3b0 = uVar50;
  uStack_3ac = uVar50;
  local_3c8 = uVar3;
  uStack_3c4 = uVar3;
  uStack_3c0 = uVar3;
  uStack_3bc = uVar3;
  uVar53 = 0;
  fVar60 = *(float *)(ray + k * 4 + 0x30);
  local_2b8 = vsubps_avx(auVar10,auVar9);
  local_2c8 = vsubps_avx(auVar11,auVar10);
  local_2d8 = vsubps_avx(_local_468,auVar11);
  local_368 = vsubps_avx(_local_4a8,local_498);
  local_378 = vsubps_avx(_local_4f8,local_4d8);
  local_388 = vsubps_avx(_local_508,local_4e8);
  _local_398 = vsubps_avx(_local_4c8,local_4b8);
  _local_678 = ZEXT816(0x3f80000000000000);
  local_358 = _local_678;
  do {
    auVar8 = vshufps_avx(_local_678,_local_678,0x50);
    auVar106._8_4_ = 0x3f800000;
    auVar106._0_8_ = &DAT_3f8000003f800000;
    auVar106._12_4_ = 0x3f800000;
    auVar112._16_4_ = 0x3f800000;
    auVar112._0_16_ = auVar106;
    auVar112._20_4_ = 0x3f800000;
    auVar112._24_4_ = 0x3f800000;
    auVar112._28_4_ = 0x3f800000;
    auVar68 = vsubps_avx(auVar106,auVar8);
    fVar130 = auVar8._0_4_;
    auVar66._0_4_ = local_428._0_4_ * fVar130;
    fVar145 = auVar8._4_4_;
    auVar66._4_4_ = local_428._4_4_ * fVar145;
    fVar146 = auVar8._8_4_;
    auVar66._8_4_ = local_428._8_4_ * fVar146;
    fVar147 = auVar8._12_4_;
    auVar66._12_4_ = local_428._12_4_ * fVar147;
    auVar137._0_4_ = local_438._0_4_ * fVar130;
    auVar137._4_4_ = local_438._4_4_ * fVar145;
    auVar137._8_4_ = local_438._8_4_ * fVar146;
    auVar137._12_4_ = local_438._12_4_ * fVar147;
    auVar180._0_4_ = local_448._0_4_ * fVar130;
    auVar180._4_4_ = local_448._4_4_ * fVar145;
    auVar180._8_4_ = local_448._8_4_ * fVar146;
    auVar180._12_4_ = local_448._12_4_ * fVar147;
    auVar263._0_4_ = local_458._0_4_ * fVar130;
    auVar263._4_4_ = local_458._4_4_ * fVar145;
    auVar263._8_4_ = local_458._8_4_ * fVar146;
    auVar263._12_4_ = local_458._12_4_ * fVar147;
    auVar63 = vfmadd231ps_fma(auVar66,auVar68,local_3e8);
    auVar94 = vfmadd231ps_fma(auVar137,auVar68,local_3f8);
    auVar72 = vfmadd231ps_fma(auVar180,auVar68,local_408);
    auVar197 = vfmadd231ps_fma(auVar263,local_418,auVar68);
    local_608 = auVar197._0_4_;
    auVar8 = vmovshdup_avx(local_358);
    fVar130 = local_358._0_4_;
    fVar92 = (auVar8._0_4_ - fVar130) * 0.04761905;
    auVar205._4_4_ = fVar130;
    auVar205._0_4_ = fVar130;
    auVar205._8_4_ = fVar130;
    auVar205._12_4_ = fVar130;
    auVar205._16_4_ = fVar130;
    auVar205._20_4_ = fVar130;
    auVar205._24_4_ = fVar130;
    auVar205._28_4_ = fVar130;
    auVar102._0_8_ = auVar8._0_8_;
    auVar102._8_8_ = auVar102._0_8_;
    auVar102._16_8_ = auVar102._0_8_;
    auVar102._24_8_ = auVar102._0_8_;
    auVar70 = vsubps_avx(auVar102,auVar205);
    uVar61 = auVar63._0_4_;
    auVar273._4_4_ = uVar61;
    auVar273._0_4_ = uVar61;
    auVar273._8_4_ = uVar61;
    auVar273._12_4_ = uVar61;
    auVar273._16_4_ = uVar61;
    auVar273._20_4_ = uVar61;
    auVar273._24_4_ = uVar61;
    auVar273._28_4_ = uVar61;
    auVar8 = vmovshdup_avx(auVar63);
    uVar152 = auVar8._0_8_;
    auVar258._8_8_ = uVar152;
    auVar258._0_8_ = uVar152;
    auVar258._16_8_ = uVar152;
    auVar258._24_8_ = uVar152;
    fVar93 = auVar94._0_4_;
    auVar89._4_4_ = fVar93;
    auVar89._0_4_ = fVar93;
    auVar89._8_4_ = fVar93;
    auVar89._12_4_ = fVar93;
    auVar89._16_4_ = fVar93;
    auVar89._20_4_ = fVar93;
    auVar89._24_4_ = fVar93;
    auVar89._28_4_ = fVar93;
    auVar68 = vmovshdup_avx(auVar94);
    auVar167._0_8_ = auVar68._0_8_;
    auVar167._8_8_ = auVar167._0_8_;
    auVar167._16_8_ = auVar167._0_8_;
    auVar167._24_8_ = auVar167._0_8_;
    fVar148 = auVar72._0_4_;
    auVar234._4_4_ = fVar148;
    auVar234._0_4_ = fVar148;
    auVar234._8_4_ = fVar148;
    auVar234._12_4_ = fVar148;
    auVar234._16_4_ = fVar148;
    auVar234._20_4_ = fVar148;
    auVar234._24_4_ = fVar148;
    auVar234._28_4_ = fVar148;
    auVar264 = vmovshdup_avx(auVar72);
    auVar214._0_8_ = auVar264._0_8_;
    auVar214._8_8_ = auVar214._0_8_;
    auVar214._16_8_ = auVar214._0_8_;
    auVar214._24_8_ = auVar214._0_8_;
    auVar64 = vmovshdup_avx(auVar197);
    auVar73 = vfmadd132ps_fma(auVar70,auVar205,_DAT_02020f20);
    auVar70 = vsubps_avx(auVar112,ZEXT1632(auVar73));
    fVar130 = auVar73._0_4_;
    auVar266._0_4_ = fVar93 * fVar130;
    fVar145 = auVar73._4_4_;
    auVar266._4_4_ = fVar93 * fVar145;
    fVar146 = auVar73._8_4_;
    auVar266._8_4_ = fVar93 * fVar146;
    fVar147 = auVar73._12_4_;
    auVar266._12_4_ = fVar93 * fVar147;
    auVar266._16_4_ = fVar93 * 0.0;
    auVar266._20_4_ = fVar93 * 0.0;
    auVar266._24_4_ = fVar93 * 0.0;
    auVar266._28_4_ = 0;
    auVar73 = vfmadd231ps_fma(auVar266,auVar70,auVar273);
    fVar62 = auVar68._0_4_;
    auVar243._0_4_ = fVar62 * fVar130;
    fVar171 = auVar68._4_4_;
    auVar243._4_4_ = fVar171 * fVar145;
    auVar243._8_4_ = fVar62 * fVar146;
    auVar243._12_4_ = fVar171 * fVar147;
    auVar243._16_4_ = fVar62 * 0.0;
    auVar243._20_4_ = fVar171 * 0.0;
    auVar243._24_4_ = fVar62 * 0.0;
    auVar243._28_4_ = 0;
    auVar105 = vfmadd231ps_fma(auVar243,auVar70,auVar258);
    auVar12._4_4_ = fVar148 * fVar145;
    auVar12._0_4_ = fVar148 * fVar130;
    auVar12._8_4_ = fVar148 * fVar146;
    auVar12._12_4_ = fVar148 * fVar147;
    auVar12._16_4_ = fVar148 * 0.0;
    auVar12._20_4_ = fVar148 * 0.0;
    auVar12._24_4_ = fVar148 * 0.0;
    auVar12._28_4_ = auVar8._4_4_;
    auVar116 = vfmadd231ps_fma(auVar12,auVar70,auVar89);
    fVar62 = auVar264._0_4_;
    fVar171 = auVar264._4_4_;
    auVar13._4_4_ = fVar171 * fVar145;
    auVar13._0_4_ = fVar62 * fVar130;
    auVar13._8_4_ = fVar62 * fVar146;
    auVar13._12_4_ = fVar171 * fVar147;
    auVar13._16_4_ = fVar62 * 0.0;
    auVar13._20_4_ = fVar171 * 0.0;
    auVar13._24_4_ = fVar62 * 0.0;
    auVar13._28_4_ = uVar61;
    auVar120 = vfmadd231ps_fma(auVar13,auVar70,auVar167);
    auVar8 = vshufps_avx(auVar63,auVar63,0xaa);
    auVar168._0_8_ = auVar8._0_8_;
    auVar168._8_8_ = auVar168._0_8_;
    auVar168._16_8_ = auVar168._0_8_;
    auVar168._24_8_ = auVar168._0_8_;
    auVar68 = vshufps_avx(auVar63,auVar63,0xff);
    uStack_5b0 = auVar68._0_8_;
    local_5b8 = (undefined1  [8])uStack_5b0;
    uStack_5a8 = uStack_5b0;
    uStack_5a0 = uStack_5b0;
    auVar14._4_4_ = fVar145 * local_608;
    auVar14._0_4_ = fVar130 * local_608;
    auVar14._8_4_ = fVar146 * local_608;
    auVar14._12_4_ = fVar147 * local_608;
    auVar14._16_4_ = local_608 * 0.0;
    auVar14._20_4_ = local_608 * 0.0;
    auVar14._24_4_ = local_608 * 0.0;
    auVar14._28_4_ = 0x3f800000;
    auVar71 = vfmadd231ps_fma(auVar14,auVar70,auVar234);
    auVar264 = vshufps_avx(auVar94,auVar94,0xaa);
    auVar128._0_8_ = auVar264._0_8_;
    auVar128._8_8_ = auVar128._0_8_;
    auVar128._16_8_ = auVar128._0_8_;
    auVar128._24_8_ = auVar128._0_8_;
    auVar63 = vshufps_avx(auVar94,auVar94,0xff);
    auVar144._0_8_ = auVar63._0_8_;
    auVar144._8_8_ = auVar144._0_8_;
    auVar144._16_8_ = auVar144._0_8_;
    auVar144._24_8_ = auVar144._0_8_;
    fVar62 = auVar64._0_4_;
    fVar171 = auVar64._4_4_;
    auVar15._4_4_ = fVar171 * fVar145;
    auVar15._0_4_ = fVar62 * fVar130;
    auVar15._8_4_ = fVar62 * fVar146;
    auVar15._12_4_ = fVar171 * fVar147;
    auVar15._16_4_ = fVar62 * 0.0;
    auVar15._20_4_ = fVar171 * 0.0;
    auVar15._24_4_ = fVar62 * 0.0;
    auVar15._28_4_ = fVar148;
    auVar115 = vfmadd231ps_fma(auVar15,auVar70,auVar214);
    auVar16._28_4_ = fVar93;
    auVar16._0_28_ =
         ZEXT1628(CONCAT412(auVar116._12_4_ * fVar147,
                            CONCAT48(auVar116._8_4_ * fVar146,
                                     CONCAT44(auVar116._4_4_ * fVar145,auVar116._0_4_ * fVar130))));
    auVar73 = vfmadd231ps_fma(auVar16,auVar70,ZEXT1632(auVar73));
    auVar17._28_4_ = auVar68._4_4_;
    auVar17._0_28_ =
         ZEXT1628(CONCAT412(auVar120._12_4_ * fVar147,
                            CONCAT48(auVar120._8_4_ * fVar146,
                                     CONCAT44(auVar120._4_4_ * fVar145,auVar120._0_4_ * fVar130))));
    auVar105 = vfmadd231ps_fma(auVar17,auVar70,ZEXT1632(auVar105));
    auVar68 = vshufps_avx(auVar72,auVar72,0xaa);
    uVar152 = auVar68._0_8_;
    auVar244._8_8_ = uVar152;
    auVar244._0_8_ = uVar152;
    auVar244._16_8_ = uVar152;
    auVar244._24_8_ = uVar152;
    auVar64 = vshufps_avx(auVar72,auVar72,0xff);
    uVar152 = auVar64._0_8_;
    auVar267._8_8_ = uVar152;
    auVar267._0_8_ = uVar152;
    auVar267._16_8_ = uVar152;
    auVar267._24_8_ = uVar152;
    auVar116 = vfmadd231ps_fma(ZEXT1632(CONCAT412(fVar147 * auVar71._12_4_,
                                                  CONCAT48(fVar146 * auVar71._8_4_,
                                                           CONCAT44(fVar145 * auVar71._4_4_,
                                                                    fVar130 * auVar71._0_4_)))),
                               auVar70,ZEXT1632(auVar116));
    auVar94 = vshufps_avx(auVar197,auVar197,0xaa);
    auVar72 = vshufps_avx(auVar197,auVar197,0xff);
    local_608 = auVar72._0_4_;
    fStack_604 = auVar72._4_4_;
    auVar18._28_4_ = fStack_604;
    auVar18._0_28_ =
         ZEXT1628(CONCAT412(auVar115._12_4_ * fVar147,
                            CONCAT48(auVar115._8_4_ * fVar146,
                                     CONCAT44(auVar115._4_4_ * fVar145,auVar115._0_4_ * fVar130))));
    auVar72 = vfmadd231ps_fma(auVar18,auVar70,ZEXT1632(auVar120));
    auVar197 = vfmadd231ps_fma(ZEXT1632(CONCAT412(fVar147 * auVar116._12_4_,
                                                  CONCAT48(fVar146 * auVar116._8_4_,
                                                           CONCAT44(fVar145 * auVar116._4_4_,
                                                                    fVar130 * auVar116._0_4_)))),
                               auVar70,ZEXT1632(auVar73));
    auVar12 = vsubps_avx(ZEXT1632(auVar116),ZEXT1632(auVar73));
    auVar73 = vfmadd231ps_fma(ZEXT1632(CONCAT412(fVar147 * auVar72._12_4_,
                                                 CONCAT48(fVar146 * auVar72._8_4_,
                                                          CONCAT44(fVar145 * auVar72._4_4_,
                                                                   fVar130 * auVar72._0_4_)))),
                              auVar70,ZEXT1632(auVar105));
    auVar13 = vsubps_avx(ZEXT1632(auVar72),ZEXT1632(auVar105));
    fVar151 = fVar92 * auVar12._0_4_ * 3.0;
    fVar172 = fVar92 * auVar12._4_4_ * 3.0;
    auVar245._4_4_ = fVar172;
    auVar245._0_4_ = fVar151;
    fVar235 = fVar92 * auVar12._8_4_ * 3.0;
    auVar245._8_4_ = fVar235;
    fVar247 = fVar92 * auVar12._12_4_ * 3.0;
    auVar245._12_4_ = fVar247;
    fVar224 = fVar92 * auVar12._16_4_ * 3.0;
    auVar245._16_4_ = fVar224;
    fVar225 = fVar92 * auVar12._20_4_ * 3.0;
    auVar245._20_4_ = fVar225;
    fVar226 = fVar92 * auVar12._24_4_ * 3.0;
    auVar245._24_4_ = fVar226;
    auVar245._28_4_ = 0x40400000;
    local_598._0_4_ = fVar92 * auVar13._0_4_ * 3.0;
    local_598._4_4_ = fVar92 * auVar13._4_4_ * 3.0;
    fStack_590 = fVar92 * auVar13._8_4_ * 3.0;
    fStack_58c = fVar92 * auVar13._12_4_ * 3.0;
    fStack_588 = fVar92 * auVar13._16_4_ * 3.0;
    fStack_584 = fVar92 * auVar13._20_4_ * 3.0;
    fStack_580 = fVar92 * auVar13._24_4_ * 3.0;
    fStack_57c = auVar13._28_4_;
    fVar93 = auVar264._0_4_;
    fVar62 = auVar264._4_4_;
    auVar20._4_4_ = fVar62 * fVar145;
    auVar20._0_4_ = fVar93 * fVar130;
    auVar20._8_4_ = fVar93 * fVar146;
    auVar20._12_4_ = fVar62 * fVar147;
    auVar20._16_4_ = fVar93 * 0.0;
    auVar20._20_4_ = fVar62 * 0.0;
    auVar20._24_4_ = fVar93 * 0.0;
    auVar20._28_4_ = auVar12._28_4_;
    auVar264 = vfmadd231ps_fma(auVar20,auVar70,auVar168);
    fVar93 = auVar63._0_4_;
    fVar171 = auVar63._4_4_;
    auVar21._4_4_ = fVar171 * fVar145;
    auVar21._0_4_ = fVar93 * fVar130;
    auVar21._8_4_ = fVar93 * fVar146;
    auVar21._12_4_ = fVar171 * fVar147;
    auVar21._16_4_ = fVar93 * 0.0;
    auVar21._20_4_ = fVar171 * 0.0;
    auVar21._24_4_ = fVar93 * 0.0;
    auVar21._28_4_ = auVar8._4_4_;
    auVar8 = vfmadd231ps_fma(auVar21,auVar70,_local_5b8);
    fVar93 = auVar68._0_4_;
    fVar171 = auVar68._4_4_;
    auVar22._4_4_ = fVar171 * fVar145;
    auVar22._0_4_ = fVar93 * fVar130;
    auVar22._8_4_ = fVar93 * fVar146;
    auVar22._12_4_ = fVar171 * fVar147;
    auVar22._16_4_ = fVar93 * 0.0;
    auVar22._20_4_ = fVar171 * 0.0;
    auVar22._24_4_ = fVar93 * 0.0;
    auVar22._28_4_ = fVar92;
    auVar68 = vfmadd231ps_fma(auVar22,auVar70,auVar128);
    fVar93 = auVar64._0_4_;
    fVar148 = auVar64._4_4_;
    auVar23._4_4_ = fVar148 * fVar145;
    auVar23._0_4_ = fVar93 * fVar130;
    auVar23._8_4_ = fVar93 * fVar146;
    auVar23._12_4_ = fVar148 * fVar147;
    auVar23._16_4_ = fVar93 * 0.0;
    auVar23._20_4_ = fVar148 * 0.0;
    auVar23._24_4_ = fVar93 * 0.0;
    auVar23._28_4_ = fVar62;
    auVar64 = vfmadd231ps_fma(auVar23,auVar70,auVar144);
    local_2a8 = vpermps_avx2(_DAT_0205d4a0,ZEXT1632(auVar197));
    fVar93 = auVar94._0_4_;
    fVar62 = auVar94._4_4_;
    auVar24._4_4_ = fVar62 * fVar145;
    auVar24._0_4_ = fVar93 * fVar130;
    auVar24._8_4_ = fVar93 * fVar146;
    auVar24._12_4_ = fVar62 * fVar147;
    auVar24._16_4_ = fVar93 * 0.0;
    auVar24._20_4_ = fVar62 * 0.0;
    auVar24._24_4_ = fVar93 * 0.0;
    auVar24._28_4_ = local_2a8._28_4_;
    auVar63 = vfmadd231ps_fma(auVar24,auVar70,auVar244);
    auVar16 = vpermps_avx2(_DAT_0205d4a0,ZEXT1632(auVar73));
    auVar25._4_4_ = fVar145 * fStack_604;
    auVar25._0_4_ = fVar130 * local_608;
    auVar25._8_4_ = fVar146 * local_608;
    auVar25._12_4_ = fVar147 * fStack_604;
    auVar25._16_4_ = local_608 * 0.0;
    auVar25._20_4_ = fStack_604 * 0.0;
    auVar25._24_4_ = local_608 * 0.0;
    auVar25._28_4_ = fVar171;
    auVar94 = vfmadd231ps_fma(auVar25,auVar70,auVar267);
    auVar26._28_4_ = fVar62;
    auVar26._0_28_ =
         ZEXT1628(CONCAT412(fVar147 * auVar68._12_4_,
                            CONCAT48(fVar146 * auVar68._8_4_,
                                     CONCAT44(fVar145 * auVar68._4_4_,fVar130 * auVar68._0_4_))));
    auVar264 = vfmadd231ps_fma(auVar26,auVar70,ZEXT1632(auVar264));
    auVar8 = vfmadd231ps_fma(ZEXT1632(CONCAT412(fVar147 * auVar64._12_4_,
                                                CONCAT48(fVar146 * auVar64._8_4_,
                                                         CONCAT44(fVar145 * auVar64._4_4_,
                                                                  fVar130 * auVar64._0_4_)))),
                             auVar70,ZEXT1632(auVar8));
    fVar151 = auVar197._0_4_ + fVar151;
    fVar172 = auVar197._4_4_ + fVar172;
    fVar235 = auVar197._8_4_ + fVar235;
    fVar247 = auVar197._12_4_ + fVar247;
    fVar224 = fVar224 + 0.0;
    fVar225 = fVar225 + 0.0;
    fVar226 = fVar226 + 0.0;
    auVar27._28_4_ = 0x40400000;
    auVar27._0_28_ =
         ZEXT1628(CONCAT412(auVar94._12_4_ * fVar147,
                            CONCAT48(auVar94._8_4_ * fVar146,
                                     CONCAT44(auVar94._4_4_ * fVar145,auVar94._0_4_ * fVar130))));
    auVar68 = vfmadd231ps_fma(ZEXT1632(CONCAT412(fVar147 * auVar63._12_4_,
                                                 CONCAT48(fVar146 * auVar63._8_4_,
                                                          CONCAT44(fVar145 * auVar63._4_4_,
                                                                   fVar130 * auVar63._0_4_)))),
                              auVar70,ZEXT1632(auVar68));
    auVar64 = vfmadd231ps_fma(auVar27,auVar70,ZEXT1632(auVar64));
    auVar63 = vfmadd231ps_fma(ZEXT1632(CONCAT412(fVar147 * auVar68._12_4_,
                                                 CONCAT48(fVar146 * auVar68._8_4_,
                                                          CONCAT44(fVar145 * auVar68._4_4_,
                                                                   fVar130 * auVar68._0_4_)))),
                              auVar70,ZEXT1632(auVar264));
    auVar94 = vfmadd231ps_fma(ZEXT1632(CONCAT412(fVar147 * auVar64._12_4_,
                                                 CONCAT48(fVar146 * auVar64._8_4_,
                                                          CONCAT44(fVar145 * auVar64._4_4_,
                                                                   fVar130 * auVar64._0_4_)))),
                              ZEXT1632(auVar8),auVar70);
    auVar70 = vsubps_avx(ZEXT1632(auVar68),ZEXT1632(auVar264));
    auVar12 = vsubps_avx(ZEXT1632(auVar64),ZEXT1632(auVar8));
    fVar130 = fVar92 * auVar70._0_4_ * 3.0;
    fVar145 = fVar92 * auVar70._4_4_ * 3.0;
    auVar28._4_4_ = fVar145;
    auVar28._0_4_ = fVar130;
    fVar146 = fVar92 * auVar70._8_4_ * 3.0;
    auVar28._8_4_ = fVar146;
    fVar147 = fVar92 * auVar70._12_4_ * 3.0;
    auVar28._12_4_ = fVar147;
    fVar148 = fVar92 * auVar70._16_4_ * 3.0;
    auVar28._16_4_ = fVar148;
    fVar149 = fVar92 * auVar70._20_4_ * 3.0;
    auVar28._20_4_ = fVar149;
    fVar150 = fVar92 * auVar70._24_4_ * 3.0;
    auVar28._24_4_ = fVar150;
    auVar28._28_4_ = 0x40400000;
    auVar190._0_4_ = fVar92 * auVar12._0_4_ * 3.0;
    auVar190._4_4_ = fVar92 * auVar12._4_4_ * 3.0;
    auVar190._8_4_ = fVar92 * auVar12._8_4_ * 3.0;
    auVar190._12_4_ = fVar92 * auVar12._12_4_ * 3.0;
    auVar190._16_4_ = fVar92 * auVar12._16_4_ * 3.0;
    auVar190._20_4_ = fVar92 * auVar12._20_4_ * 3.0;
    auVar190._24_4_ = fVar92 * auVar12._24_4_ * 3.0;
    auVar190._28_4_ = 0;
    auVar17 = vpermps_avx2(_DAT_0205d4a0,ZEXT1632(auVar63));
    local_78 = vpermps_avx2(_DAT_0205d4a0,ZEXT1632(auVar94));
    auVar70 = vsubps_avx(ZEXT1632(auVar63),ZEXT1632(auVar197));
    auVar12 = vsubps_avx(ZEXT1632(auVar94),ZEXT1632(auVar73));
    auVar14 = vsubps_avx(auVar17,local_2a8);
    fVar170 = auVar70._0_4_ + auVar14._0_4_;
    fVar173 = auVar70._4_4_ + auVar14._4_4_;
    fVar246 = auVar70._8_4_ + auVar14._8_4_;
    fVar248 = auVar70._12_4_ + auVar14._12_4_;
    fVar174 = auVar70._16_4_ + auVar14._16_4_;
    fVar175 = auVar70._20_4_ + auVar14._20_4_;
    fVar176 = auVar70._24_4_ + auVar14._24_4_;
    auVar15 = vsubps_avx(local_78,auVar16);
    auVar259._0_4_ = auVar12._0_4_ + auVar15._0_4_;
    auVar259._4_4_ = auVar12._4_4_ + auVar15._4_4_;
    auVar259._8_4_ = auVar12._8_4_ + auVar15._8_4_;
    auVar259._12_4_ = auVar12._12_4_ + auVar15._12_4_;
    auVar259._16_4_ = auVar12._16_4_ + auVar15._16_4_;
    auVar259._20_4_ = auVar12._20_4_ + auVar15._20_4_;
    auVar259._24_4_ = auVar12._24_4_ + auVar15._24_4_;
    auVar259._28_4_ = auVar12._28_4_ + auVar15._28_4_;
    fVar92 = auVar73._0_4_;
    local_158 = fVar92 + (float)local_598._0_4_;
    fVar93 = auVar73._4_4_;
    fStack_154 = fVar93 + (float)local_598._4_4_;
    fVar62 = auVar73._8_4_;
    fStack_150 = fVar62 + fStack_590;
    fVar171 = auVar73._12_4_;
    fStack_14c = fVar171 + fStack_58c;
    fStack_148 = fStack_588 + 0.0;
    fStack_144 = fStack_584 + 0.0;
    fStack_140 = fStack_580 + 0.0;
    fStack_13c = auVar13._28_4_ + 0.0;
    local_98 = ZEXT1632(auVar197);
    auVar12 = vsubps_avx(local_98,auVar245);
    local_d8 = vpermps_avx2(_DAT_0205d4a0,auVar12);
    local_b8 = ZEXT1632(auVar73);
    auVar12 = vsubps_avx(local_b8,_local_598);
    local_178 = vpermps_avx2(_DAT_0205d4a0,auVar12);
    local_f8._0_4_ = auVar63._0_4_ + fVar130;
    local_f8._4_4_ = auVar63._4_4_ + fVar145;
    local_f8._8_4_ = auVar63._8_4_ + fVar146;
    local_f8._12_4_ = auVar63._12_4_ + fVar147;
    local_f8._16_4_ = fVar148 + 0.0;
    local_f8._20_4_ = fVar149 + 0.0;
    local_f8._24_4_ = fVar150 + 0.0;
    local_f8._28_4_ = 0x40400000;
    auVar245 = ZEXT1632(auVar63);
    auVar12 = vsubps_avx(auVar245,auVar28);
    auVar18 = vpermps_avx2(_DAT_0205d4a0,auVar12);
    fVar130 = auVar94._0_4_;
    local_138._0_4_ = fVar130 + auVar190._0_4_;
    fVar145 = auVar94._4_4_;
    local_138._4_4_ = fVar145 + auVar190._4_4_;
    fVar146 = auVar94._8_4_;
    local_138._8_4_ = fVar146 + auVar190._8_4_;
    fVar147 = auVar94._12_4_;
    local_138._12_4_ = fVar147 + auVar190._12_4_;
    local_138._16_4_ = auVar190._16_4_ + 0.0;
    local_138._20_4_ = auVar190._20_4_ + 0.0;
    local_138._24_4_ = auVar190._24_4_ + 0.0;
    local_138._28_4_ = 0;
    auVar12 = vsubps_avx(ZEXT1632(auVar94),auVar190);
    local_118 = vpermps_avx2(_DAT_0205d4a0,auVar12);
    auVar29._4_4_ = fVar93 * fVar173;
    auVar29._0_4_ = fVar92 * fVar170;
    auVar29._8_4_ = fVar62 * fVar246;
    auVar29._12_4_ = fVar171 * fVar248;
    auVar29._16_4_ = fVar174 * 0.0;
    auVar29._20_4_ = fVar175 * 0.0;
    auVar29._24_4_ = fVar176 * 0.0;
    auVar29._28_4_ = auVar12._28_4_;
    auVar8 = vfnmadd231ps_fma(auVar29,local_98,auVar259);
    auVar30._4_4_ = fStack_154 * fVar173;
    auVar30._0_4_ = local_158 * fVar170;
    auVar30._8_4_ = fStack_150 * fVar246;
    auVar30._12_4_ = fStack_14c * fVar248;
    auVar30._16_4_ = fStack_148 * fVar174;
    auVar30._20_4_ = fStack_144 * fVar175;
    auVar30._24_4_ = fStack_140 * fVar176;
    auVar30._28_4_ = auVar18._28_4_;
    auVar43._4_4_ = fVar172;
    auVar43._0_4_ = fVar151;
    auVar43._8_4_ = fVar235;
    auVar43._12_4_ = fVar247;
    auVar43._16_4_ = fVar224;
    auVar43._20_4_ = fVar225;
    auVar43._24_4_ = fVar226;
    auVar43._28_4_ = 0x40400000;
    auVar68 = vfnmadd231ps_fma(auVar30,auVar259,auVar43);
    auVar31._4_4_ = local_178._4_4_ * fVar173;
    auVar31._0_4_ = local_178._0_4_ * fVar170;
    auVar31._8_4_ = local_178._8_4_ * fVar246;
    auVar31._12_4_ = local_178._12_4_ * fVar248;
    auVar31._16_4_ = local_178._16_4_ * fVar174;
    auVar31._20_4_ = local_178._20_4_ * fVar175;
    auVar31._24_4_ = local_178._24_4_ * fVar176;
    auVar31._28_4_ = fStack_13c;
    auVar264 = vfnmadd231ps_fma(auVar31,local_d8,auVar259);
    local_5b8._0_4_ = auVar16._0_4_;
    local_5b8._4_4_ = auVar16._4_4_;
    uStack_5b0._0_4_ = auVar16._8_4_;
    uStack_5b0._4_4_ = auVar16._12_4_;
    uStack_5a8._0_4_ = auVar16._16_4_;
    uStack_5a8._4_4_ = auVar16._20_4_;
    uStack_5a0._0_4_ = auVar16._24_4_;
    auVar32._4_4_ = fVar173 * (float)local_5b8._4_4_;
    auVar32._0_4_ = fVar170 * (float)local_5b8._0_4_;
    auVar32._8_4_ = fVar246 * (float)uStack_5b0;
    auVar32._12_4_ = fVar248 * uStack_5b0._4_4_;
    auVar32._16_4_ = fVar174 * (float)uStack_5a8;
    auVar32._20_4_ = fVar175 * uStack_5a8._4_4_;
    auVar32._24_4_ = fVar176 * (float)uStack_5a0;
    auVar32._28_4_ = local_178._28_4_;
    auVar64 = vfnmadd231ps_fma(auVar32,local_2a8,auVar259);
    auVar49._4_4_ = fVar145 * fVar173;
    auVar49._0_4_ = fVar130 * fVar170;
    auVar49._8_4_ = fVar146 * fVar246;
    auVar49._12_4_ = fVar147 * fVar248;
    auVar49._16_4_ = fVar174 * 0.0;
    auVar49._20_4_ = fVar175 * 0.0;
    auVar49._24_4_ = fVar176 * 0.0;
    auVar49._28_4_ = DAT_0205d4a0._28_4_;
    auVar63 = vfnmadd231ps_fma(auVar49,auVar245,auVar259);
    auVar33._4_4_ = local_138._4_4_ * fVar173;
    auVar33._0_4_ = local_138._0_4_ * fVar170;
    auVar33._8_4_ = local_138._8_4_ * fVar246;
    auVar33._12_4_ = local_138._12_4_ * fVar248;
    auVar33._16_4_ = local_138._16_4_ * fVar174;
    auVar33._20_4_ = local_138._20_4_ * fVar175;
    auVar33._24_4_ = local_138._24_4_ * fVar176;
    auVar33._28_4_ = local_2a8._28_4_;
    auVar72 = vfnmadd231ps_fma(auVar33,local_f8,auVar259);
    auVar34._4_4_ = local_118._4_4_ * fVar173;
    auVar34._0_4_ = local_118._0_4_ * fVar170;
    auVar34._8_4_ = local_118._8_4_ * fVar246;
    auVar34._12_4_ = local_118._12_4_ * fVar248;
    auVar34._16_4_ = local_118._16_4_ * fVar174;
    auVar34._20_4_ = local_118._20_4_ * fVar175;
    auVar34._24_4_ = local_118._24_4_ * fVar176;
    auVar34._28_4_ = local_d8._28_4_;
    auVar197 = vfnmadd231ps_fma(auVar34,auVar259,auVar18);
    auVar35._4_4_ = local_78._4_4_ * fVar173;
    auVar35._0_4_ = local_78._0_4_ * fVar170;
    auVar35._8_4_ = local_78._8_4_ * fVar246;
    auVar35._12_4_ = local_78._12_4_ * fVar248;
    auVar35._16_4_ = local_78._16_4_ * fVar174;
    auVar35._20_4_ = local_78._20_4_ * fVar175;
    auVar35._24_4_ = local_78._24_4_ * fVar176;
    auVar35._28_4_ = auVar70._28_4_ + auVar14._28_4_;
    auVar73 = vfnmadd231ps_fma(auVar35,auVar259,auVar17);
    auVar12 = vminps_avx(ZEXT1632(auVar8),ZEXT1632(auVar68));
    auVar70 = vmaxps_avx(ZEXT1632(auVar8),ZEXT1632(auVar68));
    auVar13 = vminps_avx(ZEXT1632(auVar264),ZEXT1632(auVar64));
    auVar13 = vminps_avx(auVar12,auVar13);
    auVar12 = vmaxps_avx(ZEXT1632(auVar264),ZEXT1632(auVar64));
    auVar70 = vmaxps_avx(auVar70,auVar12);
    auVar14 = vminps_avx(ZEXT1632(auVar63),ZEXT1632(auVar72));
    auVar12 = vmaxps_avx(ZEXT1632(auVar63),ZEXT1632(auVar72));
    auVar15 = vminps_avx(ZEXT1632(auVar197),ZEXT1632(auVar73));
    auVar14 = vminps_avx(auVar14,auVar15);
    auVar14 = vminps_avx(auVar13,auVar14);
    auVar13 = vmaxps_avx(ZEXT1632(auVar197),ZEXT1632(auVar73));
    auVar12 = vmaxps_avx(auVar12,auVar13);
    auVar12 = vmaxps_avx(auVar70,auVar12);
    auVar48._4_4_ = fStack_194;
    auVar48._0_4_ = local_198;
    auVar48._8_4_ = fStack_190;
    auVar48._12_4_ = fStack_18c;
    auVar48._16_4_ = fStack_188;
    auVar48._20_4_ = fStack_184;
    auVar48._24_4_ = fStack_180;
    auVar48._28_4_ = fStack_17c;
    auVar70 = vcmpps_avx(auVar14,auVar48,2);
    auVar47._4_4_ = fStack_1b4;
    auVar47._0_4_ = local_1b8;
    auVar47._8_4_ = fStack_1b0;
    auVar47._12_4_ = fStack_1ac;
    auVar47._16_4_ = fStack_1a8;
    auVar47._20_4_ = fStack_1a4;
    auVar47._24_4_ = fStack_1a0;
    auVar47._28_4_ = fStack_19c;
    auVar12 = vcmpps_avx(auVar12,auVar47,5);
    auVar70 = vandps_avx(auVar12,auVar70);
    auVar12 = local_288 & auVar70;
    uVar51 = 0;
    if ((((((((auVar12 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
             (auVar12 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
            (auVar12 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
           SUB321(auVar12 >> 0x7f,0) != '\0') ||
          (auVar12 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
         SUB321(auVar12 >> 0xbf,0) != '\0') ||
        (auVar12 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) || auVar12[0x1f] < '\0')
    {
      auVar12 = vsubps_avx(local_2a8,local_98);
      auVar13 = vsubps_avx(auVar17,auVar245);
      fVar149 = auVar12._0_4_ + auVar13._0_4_;
      fVar150 = auVar12._4_4_ + auVar13._4_4_;
      fVar170 = auVar12._8_4_ + auVar13._8_4_;
      fVar173 = auVar12._12_4_ + auVar13._12_4_;
      fVar246 = auVar12._16_4_ + auVar13._16_4_;
      fVar248 = auVar12._20_4_ + auVar13._20_4_;
      fVar174 = auVar12._24_4_ + auVar13._24_4_;
      auVar14 = vsubps_avx(auVar16,local_b8);
      auVar15 = vsubps_avx(local_78,ZEXT1632(auVar94));
      auVar90._0_4_ = auVar14._0_4_ + auVar15._0_4_;
      auVar90._4_4_ = auVar14._4_4_ + auVar15._4_4_;
      auVar90._8_4_ = auVar14._8_4_ + auVar15._8_4_;
      auVar90._12_4_ = auVar14._12_4_ + auVar15._12_4_;
      auVar90._16_4_ = auVar14._16_4_ + auVar15._16_4_;
      auVar90._20_4_ = auVar14._20_4_ + auVar15._20_4_;
      auVar90._24_4_ = auVar14._24_4_ + auVar15._24_4_;
      fVar148 = auVar15._28_4_;
      auVar90._28_4_ = auVar14._28_4_ + fVar148;
      auVar268._0_4_ = fVar92 * fVar149;
      auVar268._4_4_ = fVar93 * fVar150;
      auVar268._8_4_ = fVar62 * fVar170;
      auVar268._12_4_ = fVar171 * fVar173;
      auVar268._16_4_ = fVar246 * 0.0;
      auVar268._20_4_ = fVar248 * 0.0;
      auVar268._24_4_ = fVar174 * 0.0;
      auVar268._28_4_ = 0;
      auVar63 = vfnmadd231ps_fma(auVar268,auVar90,local_98);
      auVar36._4_4_ = fVar150 * fStack_154;
      auVar36._0_4_ = fVar149 * local_158;
      auVar36._8_4_ = fVar170 * fStack_150;
      auVar36._12_4_ = fVar173 * fStack_14c;
      auVar36._16_4_ = fVar246 * fStack_148;
      auVar36._20_4_ = fVar248 * fStack_144;
      auVar36._24_4_ = fVar174 * fStack_140;
      auVar36._28_4_ = fVar148;
      auVar44._4_4_ = fVar172;
      auVar44._0_4_ = fVar151;
      auVar44._8_4_ = fVar235;
      auVar44._12_4_ = fVar247;
      auVar44._16_4_ = fVar224;
      auVar44._20_4_ = fVar225;
      auVar44._24_4_ = fVar226;
      auVar44._28_4_ = 0x40400000;
      auVar8 = vfnmadd213ps_fma(auVar44,auVar90,auVar36);
      auVar37._4_4_ = fVar150 * local_178._4_4_;
      auVar37._0_4_ = fVar149 * local_178._0_4_;
      auVar37._8_4_ = fVar170 * local_178._8_4_;
      auVar37._12_4_ = fVar173 * local_178._12_4_;
      auVar37._16_4_ = fVar246 * local_178._16_4_;
      auVar37._20_4_ = fVar248 * local_178._20_4_;
      auVar37._24_4_ = fVar174 * local_178._24_4_;
      auVar37._28_4_ = fVar148;
      auVar68 = vfnmadd213ps_fma(local_d8,auVar90,auVar37);
      auVar38._4_4_ = (float)local_5b8._4_4_ * fVar150;
      auVar38._0_4_ = (float)local_5b8._0_4_ * fVar149;
      auVar38._8_4_ = (float)uStack_5b0 * fVar170;
      auVar38._12_4_ = uStack_5b0._4_4_ * fVar173;
      auVar38._16_4_ = (float)uStack_5a8 * fVar246;
      auVar38._20_4_ = uStack_5a8._4_4_ * fVar248;
      auVar38._24_4_ = (float)uStack_5a0 * fVar174;
      auVar38._28_4_ = fVar148;
      auVar94 = vfnmadd231ps_fma(auVar38,auVar90,local_2a8);
      auVar103._0_4_ = fVar130 * fVar149;
      auVar103._4_4_ = fVar145 * fVar150;
      auVar103._8_4_ = fVar146 * fVar170;
      auVar103._12_4_ = fVar147 * fVar173;
      auVar103._16_4_ = fVar246 * 0.0;
      auVar103._20_4_ = fVar248 * 0.0;
      auVar103._24_4_ = fVar174 * 0.0;
      auVar103._28_4_ = 0;
      auVar72 = vfnmadd231ps_fma(auVar103,auVar90,auVar245);
      auVar39._4_4_ = fVar150 * local_138._4_4_;
      auVar39._0_4_ = fVar149 * local_138._0_4_;
      auVar39._8_4_ = fVar170 * local_138._8_4_;
      auVar39._12_4_ = fVar173 * local_138._12_4_;
      auVar39._16_4_ = fVar246 * local_138._16_4_;
      auVar39._20_4_ = fVar248 * local_138._20_4_;
      auVar39._24_4_ = fVar174 * local_138._24_4_;
      auVar39._28_4_ = auVar16._28_4_;
      auVar264 = vfnmadd213ps_fma(local_f8,auVar90,auVar39);
      auVar40._4_4_ = fVar150 * local_118._4_4_;
      auVar40._0_4_ = fVar149 * local_118._0_4_;
      auVar40._8_4_ = fVar170 * local_118._8_4_;
      auVar40._12_4_ = fVar173 * local_118._12_4_;
      auVar40._16_4_ = fVar246 * local_118._16_4_;
      auVar40._20_4_ = fVar248 * local_118._20_4_;
      auVar40._24_4_ = fVar174 * local_118._24_4_;
      auVar40._28_4_ = auVar16._28_4_;
      auVar64 = vfnmadd213ps_fma(auVar18,auVar90,auVar40);
      auVar41._4_4_ = local_78._4_4_ * fVar150;
      auVar41._0_4_ = local_78._0_4_ * fVar149;
      auVar41._8_4_ = local_78._8_4_ * fVar170;
      auVar41._12_4_ = local_78._12_4_ * fVar173;
      auVar41._16_4_ = local_78._16_4_ * fVar246;
      auVar41._20_4_ = local_78._20_4_ * fVar248;
      auVar41._24_4_ = local_78._24_4_ * fVar174;
      auVar41._28_4_ = auVar12._28_4_ + auVar13._28_4_;
      auVar197 = vfnmadd231ps_fma(auVar41,auVar90,auVar17);
      auVar13 = vminps_avx(ZEXT1632(auVar63),ZEXT1632(auVar8));
      auVar12 = vmaxps_avx(ZEXT1632(auVar63),ZEXT1632(auVar8));
      auVar14 = vminps_avx(ZEXT1632(auVar68),ZEXT1632(auVar94));
      auVar14 = vminps_avx(auVar13,auVar14);
      auVar13 = vmaxps_avx(ZEXT1632(auVar68),ZEXT1632(auVar94));
      auVar12 = vmaxps_avx(auVar12,auVar13);
      auVar15 = vminps_avx(ZEXT1632(auVar72),ZEXT1632(auVar264));
      auVar13 = vmaxps_avx(ZEXT1632(auVar72),ZEXT1632(auVar264));
      auVar16 = vminps_avx(ZEXT1632(auVar64),ZEXT1632(auVar197));
      auVar15 = vminps_avx(auVar15,auVar16);
      auVar15 = vminps_avx(auVar14,auVar15);
      auVar14 = vmaxps_avx(ZEXT1632(auVar64),ZEXT1632(auVar197));
      auVar13 = vmaxps_avx(auVar13,auVar14);
      auVar13 = vmaxps_avx(auVar12,auVar13);
      auVar12 = vcmpps_avx(auVar15,auVar48,2);
      auVar13 = vcmpps_avx(auVar13,auVar47,5);
      auVar12 = vandps_avx(auVar13,auVar12);
      auVar70 = vandps_avx(auVar70,local_288);
      auVar13 = auVar70 & auVar12;
      if ((((((((auVar13 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
               (auVar13 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
              (auVar13 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
             SUB321(auVar13 >> 0x7f,0) != '\0') ||
            (auVar13 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
           SUB321(auVar13 >> 0xbf,0) != '\0') ||
          (auVar13 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
          auVar13[0x1f] < '\0') {
        auVar70 = vandps_avx(auVar12,auVar70);
        uVar51 = vmovmskps_avx(auVar70);
      }
    }
    if (uVar51 != 0) {
      auStack_3d8[uVar53] = uVar51;
      uVar152 = vmovlps_avx(local_358);
      *(undefined8 *)(&uStack_268 + uVar53 * 2) = uVar152;
      uVar58 = vmovlps_avx(_local_678);
      auStack_58[uVar53] = uVar58;
      uVar53 = (ulong)((int)uVar53 + 1);
    }
    do {
      if ((int)uVar53 == 0) {
        uVar61 = *(undefined4 *)(ray + k * 4 + 0x80);
        auVar69._4_4_ = uVar61;
        auVar69._0_4_ = uVar61;
        auVar69._8_4_ = uVar61;
        auVar69._12_4_ = uVar61;
        auVar8 = vcmpps_avx(local_3a8,auVar69,2);
        uVar50 = vmovmskps_avx(auVar8);
        uVar50 = (uint)uVar59 & uVar50;
        if (uVar50 == 0) {
          return;
        }
        goto LAB_01654ef0;
      }
      uVar52 = (int)uVar53 - 1;
      uVar54 = (ulong)uVar52;
      uVar57 = auStack_3d8[uVar54];
      uVar51 = (&uStack_268)[uVar54 * 2];
      fVar130 = afStack_264[uVar54 * 2];
      iVar19 = 0;
      for (uVar58 = (ulong)uVar57; (uVar58 & 1) == 0; uVar58 = uVar58 >> 1 | 0x8000000000000000) {
        iVar19 = iVar19 + 1;
      }
      uVar57 = uVar57 - 1 & uVar57;
      if (uVar57 == 0) {
        uVar53 = (ulong)uVar52;
      }
      register0x00001348 = 0;
      local_678 = (undefined1  [8])auStack_58[uVar54];
      auStack_3d8[uVar54] = uVar57;
      fVar145 = (float)(iVar19 + 1) * 0.14285715;
      auVar8 = vfmadd231ss_fma(ZEXT416((uint)(fVar130 * (float)iVar19 * 0.14285715)),ZEXT416(uVar51)
                               ,ZEXT416((uint)(1.0 - (float)iVar19 * 0.14285715)));
      auVar68 = vfmadd231ss_fma(ZEXT416((uint)(fVar130 * fVar145)),ZEXT416(uVar51),
                                ZEXT416((uint)(1.0 - fVar145)));
      auVar169._0_4_ = auVar8._0_4_;
      fVar145 = auVar68._0_4_;
      fVar130 = fVar145 - auVar169._0_4_;
      if (0.16666667 <= fVar130) break;
      auVar264 = vshufps_avx(_local_678,_local_678,0x50);
      auVar96._8_4_ = 0x3f800000;
      auVar96._0_8_ = &DAT_3f8000003f800000;
      auVar96._12_4_ = 0x3f800000;
      auVar64 = vsubps_avx(auVar96,auVar264);
      fVar146 = auVar264._0_4_;
      auVar107._0_4_ = fVar146 * (float)local_428._0_4_;
      fVar147 = auVar264._4_4_;
      auVar107._4_4_ = fVar147 * (float)local_428._4_4_;
      fVar92 = auVar264._8_4_;
      auVar107._8_4_ = fVar92 * fStack_420;
      fVar93 = auVar264._12_4_;
      auVar107._12_4_ = fVar93 * fStack_41c;
      auVar118._0_4_ = fVar146 * (float)local_438._0_4_;
      auVar118._4_4_ = fVar147 * (float)local_438._4_4_;
      auVar118._8_4_ = fVar92 * fStack_430;
      auVar118._12_4_ = fVar93 * fStack_42c;
      auVar138._0_4_ = fVar146 * (float)local_448._0_4_;
      auVar138._4_4_ = fVar147 * (float)local_448._4_4_;
      auVar138._8_4_ = fVar92 * fStack_440;
      auVar138._12_4_ = fVar93 * fStack_43c;
      auVar81._0_4_ = fVar146 * (float)local_458._0_4_;
      auVar81._4_4_ = fVar147 * (float)local_458._4_4_;
      auVar81._8_4_ = fVar92 * fStack_450;
      auVar81._12_4_ = fVar93 * fStack_44c;
      auVar264 = vfmadd231ps_fma(auVar107,auVar64,local_3e8);
      auVar63 = vfmadd231ps_fma(auVar118,auVar64,local_3f8);
      auVar94 = vfmadd231ps_fma(auVar138,auVar64,local_408);
      auVar64 = vfmadd231ps_fma(auVar81,auVar64,local_418);
      auVar104._16_16_ = auVar264;
      auVar104._0_16_ = auVar264;
      auVar113._16_16_ = auVar63;
      auVar113._0_16_ = auVar63;
      auVar129._16_16_ = auVar94;
      auVar129._0_16_ = auVar94;
      auVar169._4_4_ = auVar169._0_4_;
      auVar169._8_4_ = auVar169._0_4_;
      auVar169._12_4_ = auVar169._0_4_;
      auVar169._20_4_ = fVar145;
      auVar169._16_4_ = fVar145;
      auVar169._24_4_ = fVar145;
      auVar169._28_4_ = fVar145;
      auVar70 = vsubps_avx(auVar113,auVar104);
      auVar63 = vfmadd213ps_fma(auVar70,auVar169,auVar104);
      auVar70 = vsubps_avx(auVar129,auVar113);
      auVar72 = vfmadd213ps_fma(auVar70,auVar169,auVar113);
      auVar264 = vsubps_avx(auVar64,auVar94);
      auVar114._16_16_ = auVar264;
      auVar114._0_16_ = auVar264;
      auVar264 = vfmadd213ps_fma(auVar114,auVar169,auVar129);
      auVar70 = vsubps_avx(ZEXT1632(auVar72),ZEXT1632(auVar63));
      auVar64 = vfmadd213ps_fma(auVar70,auVar169,ZEXT1632(auVar63));
      auVar70 = vsubps_avx(ZEXT1632(auVar264),ZEXT1632(auVar72));
      auVar264 = vfmadd213ps_fma(auVar70,auVar169,ZEXT1632(auVar72));
      auVar70 = vsubps_avx(ZEXT1632(auVar264),ZEXT1632(auVar64));
      auVar105 = vfmadd231ps_fma(ZEXT1632(auVar64),auVar70,auVar169);
      fVar171 = auVar70._4_4_ * 3.0;
      fVar62 = fVar130 * 0.33333334;
      local_2a8._0_8_ =
           CONCAT44(auVar105._4_4_ + fVar62 * fVar171,auVar105._0_4_ + fVar62 * auVar70._0_4_ * 3.0)
      ;
      local_2a8._8_4_ = auVar105._8_4_ + fVar62 * auVar70._8_4_ * 3.0;
      local_2a8._12_4_ = auVar105._12_4_ + fVar62 * auVar70._12_4_ * 3.0;
      auVar64 = vshufpd_avx(auVar105,auVar105,3);
      auVar63 = vshufpd_avx((undefined1  [16])0x0,(undefined1  [16])0x0,3);
      auVar264 = vsubps_avx(auVar64,auVar105);
      auVar94 = vsubps_avx(auVar63,(undefined1  [16])0x0);
      auVar97._0_4_ = auVar264._0_4_ + auVar94._0_4_;
      auVar97._4_4_ = auVar264._4_4_ + auVar94._4_4_;
      auVar97._8_4_ = auVar264._8_4_ + auVar94._8_4_;
      auVar97._12_4_ = auVar264._12_4_ + auVar94._12_4_;
      auVar264 = vshufps_avx(auVar105,auVar105,0xb1);
      auVar94 = vshufps_avx(local_2a8._0_16_,local_2a8._0_16_,0xb1);
      auVar250._4_4_ = auVar97._0_4_;
      auVar250._0_4_ = auVar97._0_4_;
      auVar250._8_4_ = auVar97._0_4_;
      auVar250._12_4_ = auVar97._0_4_;
      auVar72 = vshufps_avx(auVar97,auVar97,0x55);
      fVar146 = auVar72._0_4_;
      auVar181._0_4_ = auVar264._0_4_ * fVar146;
      fVar147 = auVar72._4_4_;
      auVar181._4_4_ = auVar264._4_4_ * fVar147;
      fVar92 = auVar72._8_4_;
      auVar181._8_4_ = auVar264._8_4_ * fVar92;
      fVar93 = auVar72._12_4_;
      auVar181._12_4_ = auVar264._12_4_ * fVar93;
      auVar195._0_4_ = auVar94._0_4_ * fVar146;
      auVar195._4_4_ = auVar94._4_4_ * fVar147;
      auVar195._8_4_ = auVar94._8_4_ * fVar92;
      auVar195._12_4_ = auVar94._12_4_ * fVar93;
      auVar197 = vfmadd231ps_fma(auVar181,auVar250,auVar105);
      auVar73 = vfmadd231ps_fma(auVar195,auVar250,local_2a8._0_16_);
      auVar94 = vshufps_avx(auVar197,auVar197,0xe8);
      auVar72 = vshufps_avx(auVar73,auVar73,0xe8);
      auVar264 = vcmpps_avx(auVar94,auVar72,1);
      uVar51 = vextractps_avx(auVar264,0);
      auVar116 = auVar73;
      if ((uVar51 & 1) == 0) {
        auVar116 = auVar197;
      }
      auVar119._0_4_ = fVar62 * auVar70._16_4_ * 3.0;
      auVar119._4_4_ = fVar62 * fVar171;
      auVar119._8_4_ = fVar62 * auVar70._24_4_ * 3.0;
      auVar119._12_4_ = fVar62 * fVar145;
      auVar131 = vsubps_avx((undefined1  [16])0x0,auVar119);
      auVar120 = vshufps_avx(auVar131,auVar131,0xb1);
      auVar71 = vshufps_avx((undefined1  [16])0x0,(undefined1  [16])0x0,0xb1);
      auVar270._0_4_ = auVar120._0_4_ * fVar146;
      auVar270._4_4_ = auVar120._4_4_ * fVar147;
      auVar270._8_4_ = auVar120._8_4_ * fVar92;
      auVar270._12_4_ = auVar120._12_4_ * fVar93;
      auVar98._0_4_ = auVar71._0_4_ * fVar146;
      auVar98._4_4_ = auVar71._4_4_ * fVar147;
      auVar98._8_4_ = auVar71._8_4_ * fVar92;
      auVar98._12_4_ = auVar71._12_4_ * fVar93;
      auVar132 = vfmadd231ps_fma(auVar270,auVar250,auVar131);
      auVar133 = vfmadd231ps_fma(auVar98,(undefined1  [16])0x0,auVar250);
      auVar71 = vshufps_avx(auVar132,auVar132,0xe8);
      auVar115 = vshufps_avx(auVar133,auVar133,0xe8);
      auVar120 = vcmpps_avx(auVar71,auVar115,1);
      uVar51 = vextractps_avx(auVar120,0);
      auVar177 = auVar133;
      if ((uVar51 & 1) == 0) {
        auVar177 = auVar132;
      }
      auVar116 = vmaxss_avx(auVar177,auVar116);
      auVar94 = vminps_avx(auVar94,auVar72);
      auVar72 = vminps_avx(auVar71,auVar115);
      auVar72 = vminps_avx(auVar94,auVar72);
      auVar264 = vshufps_avx(auVar264,auVar264,0x55);
      auVar264 = vblendps_avx(auVar264,auVar120,2);
      auVar120 = vpslld_avx(auVar264,0x1f);
      auVar264 = vshufpd_avx(auVar73,auVar73,1);
      auVar264 = vinsertps_avx(auVar264,auVar133,0x9c);
      auVar94 = vshufpd_avx(auVar197,auVar197,1);
      auVar94 = vinsertps_avx(auVar94,auVar132,0x9c);
      auVar264 = vblendvps_avx(auVar94,auVar264,auVar120);
      auVar94 = vmovshdup_avx(auVar264);
      auVar264 = vmaxss_avx(auVar94,auVar264);
      fVar92 = auVar72._0_4_;
      auVar94 = vmovshdup_avx(auVar72);
      fVar147 = auVar264._0_4_;
      fVar146 = auVar116._0_4_;
      if ((0.0001 <= fVar92) || (fVar147 <= -0.0001)) {
        auVar197 = vcmpps_avx(auVar94,SUB6416(ZEXT464(0x38d1b717),0),1);
        auVar73 = vcmpps_avx(auVar72,SUB6416(ZEXT464(0x38d1b717),0),1);
        auVar197 = vorps_avx(auVar73,auVar197);
        if ((-0.0001 < fVar146 & auVar197[0]) != 0) goto LAB_01655f90;
        auVar197 = vcmpps_avx(SUB6416(ZEXT464(0xb8d1b717),0),auVar264,5);
        auVar73 = vcmpps_avx(auVar94,SUB6416(ZEXT464(0x38d1b717),0),5);
        auVar197 = vorps_avx(auVar73,auVar197);
        if ((auVar197 & (undefined1  [16])0x1) == (undefined1  [16])0x0) goto LAB_01655f90;
LAB_01656949:
        bVar42 = true;
      }
      else {
LAB_01655f90:
        auVar73 = vcmpps_avx(auVar72,_DAT_01feba10,1);
        auVar120 = SUB6416(ZEXT864(0),0) << 0x20;
        auVar197 = vcmpss_avx(auVar116,ZEXT816(0) << 0x20,1);
        auVar139._8_4_ = 0x3f800000;
        auVar139._0_8_ = &DAT_3f8000003f800000;
        auVar139._12_4_ = 0x3f800000;
        auVar196._8_4_ = 0xbf800000;
        auVar196._0_8_ = 0xbf800000bf800000;
        auVar196._12_4_ = 0xbf800000;
        auVar197 = vblendvps_avx(auVar139,auVar196,auVar197);
        auVar73 = vblendvps_avx(auVar139,auVar196,auVar73);
        fVar93 = auVar73._0_4_;
        fVar62 = auVar197._0_4_;
        auVar197 = SUB6416(ZEXT864(0),0) << 0x20;
        if ((fVar93 == fVar62) && (!NAN(fVar93) && !NAN(fVar62))) {
          auVar197 = SUB6416(ZEXT464(0x7f800000),0);
        }
        auVar71 = ZEXT816(0) << 0x20;
        if ((fVar93 == fVar62) && (!NAN(fVar93) && !NAN(fVar62))) {
          auVar120 = SUB6416(ZEXT464(0xff800000),0);
        }
        auVar73 = vmovshdup_avx(auVar73);
        fVar171 = auVar73._0_4_;
        if ((fVar93 != fVar171) || (NAN(fVar93) || NAN(fVar171))) {
          fVar93 = auVar94._0_4_;
          if ((fVar93 != fVar92) || (NAN(fVar93) || NAN(fVar92))) {
            auVar99._0_8_ = auVar72._0_8_ ^ 0x8000000080000000;
            auVar99._8_4_ = auVar72._8_4_ ^ 0x80000000;
            auVar99._12_4_ = auVar72._12_4_ ^ 0x80000000;
            auVar121._0_4_ = -fVar92 / (fVar93 - fVar92);
            auVar121._4_12_ = auVar99._4_12_;
            auVar94 = vfmadd213ss_fma(ZEXT416((uint)(1.0 - auVar121._0_4_)),auVar71,auVar121);
            auVar72 = auVar94;
          }
          else {
            auVar94 = SUB6416(ZEXT464(0x7f800000),0);
            if ((fVar92 == 0.0) && (auVar94 = SUB6416(ZEXT464(0x7f800000),0), !NAN(fVar92))) {
              auVar94 = ZEXT816(0);
            }
            auVar72 = SUB6416(ZEXT464(0xff800000),0);
            if ((fVar92 == 0.0) && (auVar72 = SUB6416(ZEXT464(0xff800000),0), !NAN(fVar92))) {
              auVar72 = SUB6416(ZEXT464(0x3f800000),0);
            }
          }
          auVar197 = vminss_avx(auVar197,auVar94);
          auVar120 = vmaxss_avx(auVar72,auVar120);
        }
        auVar264 = vcmpss_avx(auVar264,auVar71,1);
        auVar122._8_4_ = 0x3f800000;
        auVar122._0_8_ = &DAT_3f8000003f800000;
        auVar122._12_4_ = 0x3f800000;
        auVar140._8_4_ = 0xbf800000;
        auVar140._0_8_ = 0xbf800000bf800000;
        auVar140._12_4_ = 0xbf800000;
        auVar264 = vblendvps_avx(auVar122,auVar140,auVar264);
        fVar92 = auVar264._0_4_;
        auVar264 = SUB6416(ZEXT464(0x3f800000),0);
        if ((fVar62 != fVar92) || (NAN(fVar62) || NAN(fVar92))) {
          if ((fVar147 != fVar146) || (NAN(fVar147) || NAN(fVar146))) {
            auVar100._0_8_ = auVar116._0_8_ ^ 0x8000000080000000;
            auVar100._8_4_ = auVar116._8_4_ ^ 0x80000000;
            auVar100._12_4_ = auVar116._12_4_ ^ 0x80000000;
            auVar123._0_4_ = -fVar146 / (fVar147 - fVar146);
            auVar123._4_12_ = auVar100._4_12_;
            auVar94 = vfmadd213ss_fma(ZEXT416((uint)(1.0 - auVar123._0_4_)),auVar71,auVar123);
            auVar72 = auVar94;
          }
          else {
            auVar94 = SUB6416(ZEXT464(0x7f800000),0);
            if ((fVar146 == 0.0) && (auVar94 = SUB6416(ZEXT464(0x7f800000),0), !NAN(fVar146))) {
              auVar94 = ZEXT816(0);
            }
            auVar72 = SUB6416(ZEXT464(0xff800000),0);
            if ((fVar146 == 0.0) && (auVar72 = SUB6416(ZEXT464(0xff800000),0), !NAN(fVar146))) {
              auVar72 = auVar264;
            }
          }
          auVar197 = vminss_avx(auVar197,auVar94);
          auVar120 = vmaxss_avx(auVar72,auVar120);
        }
        if ((fVar171 != fVar92) || (NAN(fVar171) || NAN(fVar92))) {
          auVar197 = vminss_avx(auVar197,auVar264);
          auVar120 = vmaxss_avx(auVar264,auVar120);
        }
        auVar94 = vmaxss_avx(auVar71,auVar197);
        auVar72 = vminss_avx(auVar120,auVar264);
        bVar42 = true;
        if (auVar94._0_4_ <= auVar72._0_4_) {
          auVar94 = vmaxss_avx(auVar71,ZEXT416((uint)(auVar94._0_4_ + -0.1)));
          auVar264 = vminss_avx(ZEXT416((uint)(auVar72._0_4_ + 0.1)),auVar264);
          auVar82._0_8_ = auVar105._0_8_;
          auVar82._8_8_ = auVar82._0_8_;
          auVar198._8_8_ = local_2a8._0_8_;
          auVar198._0_8_ = local_2a8._0_8_;
          auVar210._8_8_ = auVar131._0_8_;
          auVar210._0_8_ = auVar131._0_8_;
          auVar72 = vshufpd_avx(local_2a8._0_16_,local_2a8._0_16_,3);
          auVar197 = vshufpd_avx(auVar131,auVar131,3);
          auVar73 = vshufps_avx(auVar94,auVar264,0);
          auVar108._8_4_ = 0x3f800000;
          auVar108._0_8_ = &DAT_3f8000003f800000;
          auVar108._12_4_ = 0x3f800000;
          auVar105 = vsubps_avx(auVar108,auVar73);
          local_598._0_4_ = auVar64._0_4_;
          local_598._4_4_ = auVar64._4_4_;
          fStack_590 = auVar64._8_4_;
          fStack_58c = auVar64._12_4_;
          fVar146 = auVar73._0_4_;
          auVar109._0_4_ = fVar146 * (float)local_598._0_4_;
          fVar147 = auVar73._4_4_;
          auVar109._4_4_ = fVar147 * (float)local_598._4_4_;
          fVar92 = auVar73._8_4_;
          auVar109._8_4_ = fVar92 * fStack_590;
          fVar93 = auVar73._12_4_;
          auVar109._12_4_ = fVar93 * fStack_58c;
          auVar124._0_4_ = auVar72._0_4_ * fVar146;
          auVar124._4_4_ = auVar72._4_4_ * fVar147;
          auVar124._8_4_ = auVar72._8_4_ * fVar92;
          auVar124._12_4_ = auVar72._12_4_ * fVar93;
          auVar141._0_4_ = auVar197._0_4_ * fVar146;
          auVar141._4_4_ = auVar197._4_4_ * fVar147;
          auVar141._8_4_ = auVar197._8_4_ * fVar92;
          auVar141._12_4_ = auVar197._12_4_ * fVar93;
          local_5b8._0_4_ = auVar63._0_4_;
          local_5b8._4_4_ = auVar63._4_4_;
          uStack_5b0._0_4_ = auVar63._8_4_;
          uStack_5b0._4_4_ = auVar63._12_4_;
          auVar164._0_4_ = fVar146 * (float)local_5b8._0_4_;
          auVar164._4_4_ = fVar147 * (float)local_5b8._4_4_;
          auVar164._8_4_ = fVar92 * (float)uStack_5b0;
          auVar164._12_4_ = fVar93 * uStack_5b0._4_4_;
          auVar72 = vfmadd231ps_fma(auVar109,auVar105,auVar82);
          auVar197 = vfmadd231ps_fma(auVar124,auVar105,auVar198);
          auVar73 = vfmadd231ps_fma(auVar141,auVar105,auVar210);
          auVar105 = vfmadd231ps_fma(auVar164,auVar105,ZEXT816(0));
          auVar64 = vmovshdup_avx(_local_678);
          auVar71 = vfmadd231ss_fma(ZEXT416((uint)(auVar64._0_4_ * auVar94._0_4_)),_local_678,
                                    ZEXT416((uint)(1.0 - auVar94._0_4_)));
          auVar115 = vfmadd231ss_fma(ZEXT416((uint)(auVar64._0_4_ * auVar264._0_4_)),_local_678,
                                     ZEXT416((uint)(1.0 - auVar264._0_4_)));
          fVar146 = 1.0 / fVar130;
          auVar264 = vsubps_avx(auVar197,auVar72);
          auVar182._0_4_ = auVar264._0_4_ * 3.0;
          auVar182._4_4_ = auVar264._4_4_ * 3.0;
          auVar182._8_4_ = auVar264._8_4_ * 3.0;
          auVar182._12_4_ = auVar264._12_4_ * 3.0;
          auVar264 = vsubps_avx(auVar73,auVar197);
          auVar199._0_4_ = auVar264._0_4_ * 3.0;
          auVar199._4_4_ = auVar264._4_4_ * 3.0;
          auVar199._8_4_ = auVar264._8_4_ * 3.0;
          auVar199._12_4_ = auVar264._12_4_ * 3.0;
          auVar264 = vsubps_avx(auVar105,auVar73);
          auVar211._0_4_ = auVar264._0_4_ * 3.0;
          auVar211._4_4_ = auVar264._4_4_ * 3.0;
          auVar211._8_4_ = auVar264._8_4_ * 3.0;
          auVar211._12_4_ = auVar264._12_4_ * 3.0;
          auVar64 = vminps_avx(auVar199,auVar211);
          auVar264 = vmaxps_avx(auVar199,auVar211);
          auVar64 = vminps_avx(auVar182,auVar64);
          auVar264 = vmaxps_avx(auVar182,auVar264);
          auVar63 = vshufpd_avx(auVar64,auVar64,3);
          auVar94 = vshufpd_avx(auVar264,auVar264,3);
          auVar64 = vminps_avx(auVar64,auVar63);
          auVar264 = vmaxps_avx(auVar264,auVar94);
          auVar200._0_4_ = auVar64._0_4_ * fVar146;
          auVar200._4_4_ = auVar64._4_4_ * fVar146;
          auVar200._8_4_ = auVar64._8_4_ * fVar146;
          auVar200._12_4_ = auVar64._12_4_ * fVar146;
          auVar183._0_4_ = fVar146 * auVar264._0_4_;
          auVar183._4_4_ = fVar146 * auVar264._4_4_;
          auVar183._8_4_ = fVar146 * auVar264._8_4_;
          auVar183._12_4_ = fVar146 * auVar264._12_4_;
          fVar146 = 1.0 / (auVar115._0_4_ - auVar71._0_4_);
          auVar264 = vshufpd_avx(auVar72,auVar72,3);
          auVar64 = vshufpd_avx(auVar197,auVar197,3);
          auVar63 = vshufpd_avx(auVar73,auVar73,3);
          auVar94 = vshufpd_avx(auVar105,auVar105,3);
          auVar264 = vsubps_avx(auVar264,auVar72);
          auVar72 = vsubps_avx(auVar64,auVar197);
          auVar197 = vsubps_avx(auVar63,auVar73);
          auVar94 = vsubps_avx(auVar94,auVar105);
          auVar64 = vminps_avx(auVar264,auVar72);
          auVar264 = vmaxps_avx(auVar264,auVar72);
          auVar63 = vminps_avx(auVar197,auVar94);
          auVar63 = vminps_avx(auVar64,auVar63);
          auVar64 = vmaxps_avx(auVar197,auVar94);
          auVar264 = vmaxps_avx(auVar264,auVar64);
          auVar229._0_4_ = fVar146 * auVar63._0_4_;
          auVar229._4_4_ = fVar146 * auVar63._4_4_;
          auVar229._8_4_ = fVar146 * auVar63._8_4_;
          auVar229._12_4_ = fVar146 * auVar63._12_4_;
          auVar217._0_4_ = fVar146 * auVar264._0_4_;
          auVar217._4_4_ = fVar146 * auVar264._4_4_;
          auVar217._8_4_ = fVar146 * auVar264._8_4_;
          auVar217._12_4_ = fVar146 * auVar264._12_4_;
          auVar94 = vinsertps_avx(auVar8,auVar71,0x10);
          auVar72 = vinsertps_avx(auVar68,auVar115,0x10);
          auVar67._0_4_ = (auVar94._0_4_ + auVar72._0_4_) * 0.5;
          auVar67._4_4_ = (auVar94._4_4_ + auVar72._4_4_) * 0.5;
          auVar67._8_4_ = (auVar94._8_4_ + auVar72._8_4_) * 0.5;
          auVar67._12_4_ = (auVar94._12_4_ + auVar72._12_4_) * 0.5;
          auVar110._4_4_ = auVar67._0_4_;
          auVar110._0_4_ = auVar67._0_4_;
          auVar110._8_4_ = auVar67._0_4_;
          auVar110._12_4_ = auVar67._0_4_;
          auVar264 = vfmadd213ps_fma(local_2b8,auVar110,auVar9);
          auVar64 = vfmadd213ps_fma(local_2c8,auVar110,auVar10);
          auVar63 = vfmadd213ps_fma(local_2d8,auVar110,auVar11);
          auVar68 = vsubps_avx(auVar64,auVar264);
          auVar264 = vfmadd213ps_fma(auVar68,auVar110,auVar264);
          auVar68 = vsubps_avx(auVar63,auVar64);
          auVar68 = vfmadd213ps_fma(auVar68,auVar110,auVar64);
          auVar68 = vsubps_avx(auVar68,auVar264);
          auVar264 = vfmadd231ps_fma(auVar264,auVar68,auVar110);
          auVar111._0_8_ = CONCAT44(auVar68._4_4_ * 3.0,auVar68._0_4_ * 3.0);
          auVar111._8_4_ = auVar68._8_4_ * 3.0;
          auVar111._12_4_ = auVar68._12_4_ * 3.0;
          auVar212._8_8_ = auVar264._0_8_;
          auVar212._0_8_ = auVar264._0_8_;
          auVar68 = vshufpd_avx(auVar264,auVar264,3);
          auVar264 = vshufps_avx(auVar67,auVar67,0x55);
          auVar197 = vsubps_avx(auVar68,auVar212);
          auVar105 = vfmadd231ps_fma(auVar212,auVar264,auVar197);
          auVar251._8_8_ = auVar111._0_8_;
          auVar251._0_8_ = auVar111._0_8_;
          auVar68 = vshufpd_avx(auVar111,auVar111,3);
          auVar68 = vsubps_avx(auVar68,auVar251);
          auVar73 = vfmadd213ps_fma(auVar68,auVar264,auVar251);
          auVar264 = vmovshdup_avx(auVar73);
          auVar252._0_8_ = auVar264._0_8_ ^ 0x8000000080000000;
          auVar252._8_4_ = auVar264._8_4_ ^ 0x80000000;
          auVar252._12_4_ = auVar264._12_4_ ^ 0x80000000;
          auVar64 = vmovshdup_avx(auVar197);
          auVar68 = vunpcklps_avx(auVar64,auVar252);
          auVar63 = vshufps_avx(auVar68,auVar252,4);
          auVar271._0_8_ = auVar197._0_8_ ^ 0x8000000080000000;
          auVar271._8_4_ = auVar197._8_4_ ^ 0x80000000;
          auVar271._12_4_ = auVar197._12_4_ ^ 0x80000000;
          auVar68 = vmovlhps_avx(auVar271,auVar73);
          auVar68 = vshufps_avx(auVar68,auVar73,8);
          auVar264 = vfmsub231ss_fma(ZEXT416((uint)(auVar264._0_4_ * auVar197._0_4_)),auVar64,
                                     auVar73);
          auVar125._0_4_ = auVar264._0_4_;
          auVar125._4_4_ = auVar125._0_4_;
          auVar125._8_4_ = auVar125._0_4_;
          auVar125._12_4_ = auVar125._0_4_;
          auVar264 = vdivps_avx(auVar63,auVar125);
          auVar64 = vdivps_avx(auVar68,auVar125);
          fVar92 = auVar105._0_4_;
          fVar146 = auVar264._0_4_;
          auVar68 = vshufps_avx(auVar105,auVar105,0x55);
          fVar147 = auVar64._0_4_;
          local_5b8._4_4_ = fVar92 * auVar264._4_4_ + auVar68._4_4_ * auVar64._4_4_;
          local_5b8._0_4_ = fVar92 * fVar146 + auVar68._0_4_ * fVar147;
          uStack_5b0._0_4_ = fVar92 * auVar264._8_4_ + auVar68._8_4_ * auVar64._8_4_;
          uStack_5b0._4_4_ = fVar92 * auVar264._12_4_ + auVar68._12_4_ * auVar64._12_4_;
          auVar197 = vmovshdup_avx(auVar264);
          auVar68 = vinsertps_avx(auVar200,auVar229,0x1c);
          auVar265._0_4_ = auVar197._0_4_ * auVar68._0_4_;
          auVar265._4_4_ = auVar197._4_4_ * auVar68._4_4_;
          auVar265._8_4_ = auVar197._8_4_ * auVar68._8_4_;
          auVar265._12_4_ = auVar197._12_4_ * auVar68._12_4_;
          auVar63 = vinsertps_avx(auVar183,auVar217,0x1c);
          auVar238._0_4_ = auVar197._0_4_ * auVar63._0_4_;
          auVar238._4_4_ = auVar197._4_4_ * auVar63._4_4_;
          auVar238._8_4_ = auVar197._8_4_ * auVar63._8_4_;
          auVar238._12_4_ = auVar197._12_4_ * auVar63._12_4_;
          auVar116 = vminps_avx(auVar265,auVar238);
          auVar105 = vmaxps_avx(auVar238,auVar265);
          auVar197 = vinsertps_avx(auVar229,auVar200,0x4c);
          auVar120 = vmovshdup_avx(auVar64);
          auVar73 = vinsertps_avx(auVar217,auVar183,0x4c);
          auVar218._0_4_ = auVar120._0_4_ * auVar197._0_4_;
          auVar218._4_4_ = auVar120._4_4_ * auVar197._4_4_;
          auVar218._8_4_ = auVar120._8_4_ * auVar197._8_4_;
          auVar218._12_4_ = auVar120._12_4_ * auVar197._12_4_;
          auVar230._0_4_ = auVar120._0_4_ * auVar73._0_4_;
          auVar230._4_4_ = auVar120._4_4_ * auVar73._4_4_;
          auVar230._8_4_ = auVar120._8_4_ * auVar73._8_4_;
          auVar230._12_4_ = auVar120._12_4_ * auVar73._12_4_;
          auVar120 = vminps_avx(auVar218,auVar230);
          auVar83._0_4_ = auVar120._0_4_ + auVar116._0_4_;
          auVar83._4_4_ = auVar120._4_4_ + auVar116._4_4_;
          auVar83._8_4_ = auVar120._8_4_ + auVar116._8_4_;
          auVar83._12_4_ = auVar120._12_4_ + auVar116._12_4_;
          auVar116 = vmaxps_avx(auVar230,auVar218);
          auVar219._0_4_ = auVar105._0_4_ + auVar116._0_4_;
          auVar219._4_4_ = auVar105._4_4_ + auVar116._4_4_;
          auVar219._8_4_ = auVar105._8_4_ + auVar116._8_4_;
          auVar219._12_4_ = auVar105._12_4_ + auVar116._12_4_;
          auVar231._8_8_ = 0x3f80000000000000;
          auVar231._0_8_ = 0x3f80000000000000;
          auVar105 = vsubps_avx(auVar231,auVar219);
          auVar116 = vsubps_avx(auVar231,auVar83);
          auVar120 = vsubps_avx(auVar94,auVar67);
          auVar253._0_4_ = fVar146 * auVar68._0_4_;
          auVar253._4_4_ = fVar146 * auVar68._4_4_;
          auVar253._8_4_ = fVar146 * auVar68._8_4_;
          auVar253._12_4_ = fVar146 * auVar68._12_4_;
          auVar239._0_4_ = fVar146 * auVar63._0_4_;
          auVar239._4_4_ = fVar146 * auVar63._4_4_;
          auVar239._8_4_ = fVar146 * auVar63._8_4_;
          auVar239._12_4_ = fVar146 * auVar63._12_4_;
          auVar63 = vminps_avx(auVar253,auVar239);
          auVar68 = vmaxps_avx(auVar239,auVar253);
          auVar201._0_4_ = fVar147 * auVar197._0_4_;
          auVar201._4_4_ = fVar147 * auVar197._4_4_;
          auVar201._8_4_ = fVar147 * auVar197._8_4_;
          auVar201._12_4_ = fVar147 * auVar197._12_4_;
          auVar184._0_4_ = fVar147 * auVar73._0_4_;
          auVar184._4_4_ = fVar147 * auVar73._4_4_;
          auVar184._8_4_ = fVar147 * auVar73._8_4_;
          auVar184._12_4_ = fVar147 * auVar73._12_4_;
          auVar197 = vminps_avx(auVar201,auVar184);
          auVar254._0_4_ = auVar63._0_4_ + auVar197._0_4_;
          auVar254._4_4_ = auVar63._4_4_ + auVar197._4_4_;
          auVar254._8_4_ = auVar63._8_4_ + auVar197._8_4_;
          auVar254._12_4_ = auVar63._12_4_ + auVar197._12_4_;
          auVar197 = vsubps_avx(auVar72,auVar67);
          auVar63 = vmaxps_avx(auVar184,auVar201);
          fVar92 = auVar120._0_4_;
          auVar202._0_4_ = fVar92 * auVar105._0_4_;
          fVar93 = auVar120._4_4_;
          auVar202._4_4_ = fVar93 * auVar105._4_4_;
          fVar62 = auVar120._8_4_;
          auVar202._8_4_ = fVar62 * auVar105._8_4_;
          fVar171 = auVar120._12_4_;
          auVar202._12_4_ = fVar171 * auVar105._12_4_;
          auVar185._0_4_ = auVar68._0_4_ + auVar63._0_4_;
          auVar185._4_4_ = auVar68._4_4_ + auVar63._4_4_;
          auVar185._8_4_ = auVar68._8_4_ + auVar63._8_4_;
          auVar185._12_4_ = auVar68._12_4_ + auVar63._12_4_;
          auVar240._8_8_ = 0x3f800000;
          auVar240._0_8_ = 0x3f800000;
          auVar68 = vsubps_avx(auVar240,auVar185);
          auVar63 = vsubps_avx(auVar240,auVar254);
          auVar255._0_4_ = fVar92 * auVar116._0_4_;
          auVar255._4_4_ = fVar93 * auVar116._4_4_;
          auVar255._8_4_ = fVar62 * auVar116._8_4_;
          auVar255._12_4_ = fVar171 * auVar116._12_4_;
          fVar148 = auVar197._0_4_;
          auVar220._0_4_ = fVar148 * auVar105._0_4_;
          fVar149 = auVar197._4_4_;
          auVar220._4_4_ = fVar149 * auVar105._4_4_;
          fVar150 = auVar197._8_4_;
          auVar220._8_4_ = fVar150 * auVar105._8_4_;
          fVar151 = auVar197._12_4_;
          auVar220._12_4_ = fVar151 * auVar105._12_4_;
          auVar84._0_4_ = fVar148 * auVar116._0_4_;
          auVar84._4_4_ = fVar149 * auVar116._4_4_;
          auVar84._8_4_ = fVar150 * auVar116._8_4_;
          auVar84._12_4_ = fVar151 * auVar116._12_4_;
          auVar272._0_4_ = fVar92 * auVar68._0_4_;
          auVar272._4_4_ = fVar93 * auVar68._4_4_;
          auVar272._8_4_ = fVar62 * auVar68._8_4_;
          auVar272._12_4_ = fVar171 * auVar68._12_4_;
          auVar232._0_4_ = fVar92 * auVar63._0_4_;
          auVar232._4_4_ = fVar93 * auVar63._4_4_;
          auVar232._8_4_ = fVar62 * auVar63._8_4_;
          auVar232._12_4_ = fVar171 * auVar63._12_4_;
          auVar186._0_4_ = fVar148 * auVar68._0_4_;
          auVar186._4_4_ = fVar149 * auVar68._4_4_;
          auVar186._8_4_ = fVar150 * auVar68._8_4_;
          auVar186._12_4_ = fVar151 * auVar68._12_4_;
          auVar241._0_4_ = fVar148 * auVar63._0_4_;
          auVar241._4_4_ = fVar149 * auVar63._4_4_;
          auVar241._8_4_ = fVar150 * auVar63._8_4_;
          auVar241._12_4_ = fVar151 * auVar63._12_4_;
          auVar68 = vminps_avx(auVar272,auVar232);
          auVar63 = vminps_avx(auVar186,auVar241);
          auVar68 = vminps_avx(auVar68,auVar63);
          auVar63 = vmaxps_avx(auVar232,auVar272);
          auVar197 = vminps_avx(auVar202,auVar255);
          auVar73 = vminps_avx(auVar220,auVar84);
          auVar197 = vminps_avx(auVar197,auVar73);
          auVar68 = vhaddps_avx(auVar68,auVar197);
          auVar197 = vmaxps_avx(auVar241,auVar186);
          auVar63 = vmaxps_avx(auVar197,auVar63);
          auVar197 = vmaxps_avx(auVar255,auVar202);
          auVar73 = vmaxps_avx(auVar84,auVar220);
          auVar197 = vmaxps_avx(auVar73,auVar197);
          auVar63 = vhaddps_avx(auVar63,auVar197);
          auVar197 = vshufps_avx(auVar67,auVar67,0x54);
          auVar197 = vsubps_avx(auVar197,_local_5b8);
          auVar68 = vshufps_avx(auVar68,auVar68,0xe8);
          auVar63 = vshufps_avx(auVar63,auVar63,0xe8);
          auVar203._0_4_ = auVar197._0_4_ + auVar68._0_4_;
          auVar203._4_4_ = auVar197._4_4_ + auVar68._4_4_;
          auVar203._8_4_ = auVar197._8_4_ + auVar68._8_4_;
          auVar203._12_4_ = auVar197._12_4_ + auVar68._12_4_;
          auVar187._0_4_ = auVar197._0_4_ + auVar63._0_4_;
          auVar187._4_4_ = auVar197._4_4_ + auVar63._4_4_;
          auVar187._8_4_ = auVar197._8_4_ + auVar63._8_4_;
          auVar187._12_4_ = auVar197._12_4_ + auVar63._12_4_;
          auVar68 = vmaxps_avx(auVar94,auVar203);
          auVar63 = vminps_avx(auVar187,auVar72);
          auVar68 = vcmpps_avx(auVar63,auVar68,1);
          auVar68 = vshufps_avx(auVar68,auVar68,0x50);
          _local_678 = vinsertps_avx(auVar71,ZEXT416((uint)auVar115._0_4_),0x10);
          if ((auVar68 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
              auVar68[0xf] < '\0') goto LAB_01656949;
          bVar56 = 0;
          if ((auVar169._0_4_ < auVar203._0_4_) && (bVar56 = 0, auVar187._0_4_ < auVar72._0_4_)) {
            auVar63 = vmovshdup_avx(auVar203);
            auVar68 = vcmpps_avx(auVar187,auVar72,1);
            bVar56 = auVar68[4] & auVar71._0_4_ < auVar63._0_4_;
          }
          if (((3 < (uint)uVar53 || fVar130 < 0.001) | bVar56) == 1) {
            lVar55 = 200;
            do {
              fVar62 = auVar197._0_4_;
              fVar93 = 1.0 - fVar62;
              fVar130 = fVar93 * fVar93 * fVar93;
              fVar92 = fVar62 * 3.0 * fVar93 * fVar93;
              fVar93 = fVar93 * fVar62 * fVar62 * 3.0;
              auVar142._4_4_ = fVar130;
              auVar142._0_4_ = fVar130;
              auVar142._8_4_ = fVar130;
              auVar142._12_4_ = fVar130;
              auVar101._4_4_ = fVar92;
              auVar101._0_4_ = fVar92;
              auVar101._8_4_ = fVar92;
              auVar101._12_4_ = fVar92;
              auVar85._4_4_ = fVar93;
              auVar85._0_4_ = fVar93;
              auVar85._8_4_ = fVar93;
              auVar85._12_4_ = fVar93;
              fVar62 = fVar62 * fVar62 * fVar62;
              auVar165._0_4_ = (float)local_468._0_4_ * fVar62;
              auVar165._4_4_ = (float)local_468._4_4_ * fVar62;
              auVar165._8_4_ = fStack_460 * fVar62;
              auVar165._12_4_ = fStack_45c * fVar62;
              auVar68 = vfmadd231ps_fma(auVar165,auVar11,auVar85);
              auVar68 = vfmadd231ps_fma(auVar68,auVar10,auVar101);
              auVar68 = vfmadd231ps_fma(auVar68,auVar9,auVar142);
              auVar86._8_8_ = auVar68._0_8_;
              auVar86._0_8_ = auVar68._0_8_;
              auVar68 = vshufpd_avx(auVar68,auVar68,3);
              auVar63 = vshufps_avx(auVar197,auVar197,0x55);
              auVar68 = vsubps_avx(auVar68,auVar86);
              auVar63 = vfmadd213ps_fma(auVar68,auVar63,auVar86);
              fVar130 = auVar63._0_4_;
              auVar68 = vshufps_avx(auVar63,auVar63,0x55);
              auVar87._0_4_ = fVar146 * fVar130 + fVar147 * auVar68._0_4_;
              auVar87._4_4_ = auVar264._4_4_ * fVar130 + auVar64._4_4_ * auVar68._4_4_;
              auVar87._8_4_ = auVar264._8_4_ * fVar130 + auVar64._8_4_ * auVar68._8_4_;
              auVar87._12_4_ = auVar264._12_4_ * fVar130 + auVar64._12_4_ * auVar68._12_4_;
              auVar197 = vsubps_avx(auVar197,auVar87);
              auVar68 = vandps_avx(auVar269,auVar63);
              auVar63 = vshufps_avx(auVar68,auVar68,0xf5);
              auVar68 = vmaxss_avx(auVar63,auVar68);
              if (auVar68._0_4_ < (float)local_2e8._0_4_) {
                local_218 = auVar197._0_4_;
                if ((0.0 <= local_218) && (local_218 <= 1.0)) {
                  auVar68 = vmovshdup_avx(auVar197);
                  fVar130 = auVar68._0_4_;
                  if ((0.0 <= fVar130) && (fVar130 <= 1.0)) {
                    auVar68 = vinsertps_avx(ZEXT416((uint)pre->ray_space[k].vx.field_0.m128[2]),
                                            ZEXT416((uint)pre->ray_space[k].vy.field_0.m128[2]),0x1c
                                           );
                    auVar105 = vinsertps_avx(auVar68,ZEXT416((uint)pre->ray_space[k].vz.field_0.m128
                                                                   [2]),0x28);
                    auVar68 = vdpps_avx(auVar105,local_478,0x7f);
                    auVar264 = vdpps_avx(auVar105,local_488,0x7f);
                    auVar64 = vdpps_avx(auVar105,local_2f8,0x7f);
                    auVar63 = vdpps_avx(auVar105,local_308,0x7f);
                    auVar94 = vdpps_avx(auVar105,local_318,0x7f);
                    auVar72 = vdpps_avx(auVar105,local_328,0x7f);
                    auVar73 = vdpps_avx(auVar105,local_338,0x7f);
                    auVar105 = vdpps_avx(auVar105,local_348,0x7f);
                    fVar146 = 1.0 - fVar130;
                    auVar68 = vfmadd231ss_fma(ZEXT416((uint)(fVar130 * auVar94._0_4_)),
                                              ZEXT416((uint)fVar146),auVar68);
                    auVar264 = vfmadd231ss_fma(ZEXT416((uint)(auVar72._0_4_ * fVar130)),
                                               ZEXT416((uint)fVar146),auVar264);
                    auVar64 = vfmadd231ss_fma(ZEXT416((uint)(auVar73._0_4_ * fVar130)),
                                              ZEXT416((uint)fVar146),auVar64);
                    auVar63 = vfmadd231ss_fma(ZEXT416((uint)(fVar130 * auVar105._0_4_)),
                                              ZEXT416((uint)fVar146),auVar63);
                    fVar93 = 1.0 - local_218;
                    fVar146 = fVar93 * local_218 * local_218 * 3.0;
                    fVar171 = local_218 * local_218 * local_218;
                    auVar64 = vfmadd231ss_fma(ZEXT416((uint)(fVar171 * auVar63._0_4_)),
                                              ZEXT416((uint)fVar146),auVar64);
                    fVar147 = local_218 * 3.0 * fVar93 * fVar93;
                    auVar264 = vfmadd231ss_fma(auVar64,ZEXT416((uint)fVar147),auVar264);
                    fVar92 = fVar93 * fVar93 * fVar93;
                    auVar68 = vfmadd231ss_fma(auVar264,ZEXT416((uint)fVar92),auVar68);
                    fVar62 = auVar68._0_4_;
                    if (((fVar60 <= fVar62) &&
                        (fVar148 = *(float *)(ray + k * 4 + 0x80), fVar62 <= fVar148)) &&
                       (pGVar4 = (context->scene->geometries).items[uVar50].ptr,
                       (pGVar4->mask & *(uint *)(ray + k * 4 + 0x90)) != 0)) {
                      auVar68 = vshufps_avx(auVar197,auVar197,0x55);
                      auVar213._8_4_ = 0x3f800000;
                      auVar213._0_8_ = &DAT_3f8000003f800000;
                      auVar213._12_4_ = 0x3f800000;
                      auVar264 = vsubps_avx(auVar213,auVar68);
                      fVar149 = auVar68._0_4_;
                      auVar221._0_4_ = fVar149 * (float)local_4a8._0_4_;
                      fVar150 = auVar68._4_4_;
                      auVar221._4_4_ = fVar150 * (float)local_4a8._4_4_;
                      fVar151 = auVar68._8_4_;
                      auVar221._8_4_ = fVar151 * fStack_4a0;
                      fVar170 = auVar68._12_4_;
                      auVar221._12_4_ = fVar170 * fStack_49c;
                      auVar233._0_4_ = fVar149 * (float)local_4f8._0_4_;
                      auVar233._4_4_ = fVar150 * (float)local_4f8._4_4_;
                      auVar233._8_4_ = fVar151 * fStack_4f0;
                      auVar233._12_4_ = fVar170 * fStack_4ec;
                      auVar242._0_4_ = fVar149 * (float)local_508._0_4_;
                      auVar242._4_4_ = fVar150 * (float)local_508._4_4_;
                      auVar242._8_4_ = fVar151 * fStack_500;
                      auVar242._12_4_ = fVar170 * fStack_4fc;
                      auVar256._0_4_ = fVar149 * (float)local_4c8._0_4_;
                      auVar256._4_4_ = fVar150 * (float)local_4c8._4_4_;
                      auVar256._8_4_ = fVar151 * fStack_4c0;
                      auVar256._12_4_ = fVar170 * fStack_4bc;
                      auVar64 = vfmadd231ps_fma(auVar221,auVar264,local_498);
                      auVar63 = vfmadd231ps_fma(auVar233,auVar264,local_4d8);
                      auVar94 = vfmadd231ps_fma(auVar242,auVar264,local_4e8);
                      auVar72 = vfmadd231ps_fma(auVar256,auVar264,local_4b8);
                      auVar264 = vsubps_avx(auVar63,auVar64);
                      auVar64 = vsubps_avx(auVar94,auVar63);
                      auVar63 = vsubps_avx(auVar72,auVar94);
                      auVar257._0_4_ = local_218 * auVar64._0_4_;
                      auVar257._4_4_ = local_218 * auVar64._4_4_;
                      auVar257._8_4_ = local_218 * auVar64._8_4_;
                      auVar257._12_4_ = local_218 * auVar64._12_4_;
                      auVar204._4_4_ = fVar93;
                      auVar204._0_4_ = fVar93;
                      auVar204._8_4_ = fVar93;
                      auVar204._12_4_ = fVar93;
                      auVar264 = vfmadd231ps_fma(auVar257,auVar204,auVar264);
                      auVar222._0_4_ = local_218 * auVar63._0_4_;
                      auVar222._4_4_ = local_218 * auVar63._4_4_;
                      auVar222._8_4_ = local_218 * auVar63._8_4_;
                      auVar222._12_4_ = local_218 * auVar63._12_4_;
                      auVar64 = vfmadd231ps_fma(auVar222,auVar204,auVar64);
                      auVar223._0_4_ = local_218 * auVar64._0_4_;
                      auVar223._4_4_ = local_218 * auVar64._4_4_;
                      auVar223._8_4_ = local_218 * auVar64._8_4_;
                      auVar223._12_4_ = local_218 * auVar64._12_4_;
                      auVar64 = vfmadd231ps_fma(auVar223,auVar204,auVar264);
                      auVar188._0_4_ = fVar171 * (float)local_398._0_4_;
                      auVar188._4_4_ = fVar171 * (float)local_398._4_4_;
                      auVar188._8_4_ = fVar171 * fStack_390;
                      auVar188._12_4_ = fVar171 * fStack_38c;
                      auVar126._4_4_ = fVar146;
                      auVar126._0_4_ = fVar146;
                      auVar126._8_4_ = fVar146;
                      auVar126._12_4_ = fVar146;
                      auVar264 = vfmadd132ps_fma(auVar126,auVar188,local_388);
                      auVar166._4_4_ = fVar147;
                      auVar166._0_4_ = fVar147;
                      auVar166._8_4_ = fVar147;
                      auVar166._12_4_ = fVar147;
                      auVar264 = vfmadd132ps_fma(auVar166,auVar264,local_378);
                      auVar189._0_4_ = auVar64._0_4_ * 3.0;
                      auVar189._4_4_ = auVar64._4_4_ * 3.0;
                      auVar189._8_4_ = auVar64._8_4_ * 3.0;
                      auVar189._12_4_ = auVar64._12_4_ * 3.0;
                      auVar143._4_4_ = fVar92;
                      auVar143._0_4_ = fVar92;
                      auVar143._8_4_ = fVar92;
                      auVar143._12_4_ = fVar92;
                      auVar64 = vfmadd132ps_fma(auVar143,auVar264,local_368);
                      auVar264 = vshufps_avx(auVar189,auVar189,0xc9);
                      auVar127._0_4_ = auVar64._0_4_ * auVar264._0_4_;
                      auVar127._4_4_ = auVar64._4_4_ * auVar264._4_4_;
                      auVar127._8_4_ = auVar64._8_4_ * auVar264._8_4_;
                      auVar127._12_4_ = auVar64._12_4_ * auVar264._12_4_;
                      auVar264 = vshufps_avx(auVar64,auVar64,0xc9);
                      auVar264 = vfmsub231ps_fma(auVar127,auVar189,auVar264);
                      local_228 = auVar264._0_4_;
                      if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                         (pGVar4->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                        *(float *)(ray + k * 4 + 0x80) = fVar62;
                        uVar61 = vextractps_avx(auVar264,1);
                        *(undefined4 *)(ray + k * 4 + 0xc0) = uVar61;
                        uVar61 = vextractps_avx(auVar264,2);
                        *(undefined4 *)(ray + k * 4 + 0xd0) = uVar61;
                        *(undefined4 *)(ray + k * 4 + 0xe0) = local_228;
                        *(float *)(ray + k * 4 + 0xf0) = local_218;
                        *(float *)(ray + k * 4 + 0x100) = fVar130;
                        *(uint *)(ray + k * 4 + 0x110) = uVar3;
                        *(uint *)(ray + k * 4 + 0x120) = uVar50;
                        *(uint *)(ray + k * 4 + 0x130) = context->user->instID[0];
                        *(uint *)(ray + k * 4 + 0x140) = context->user->instPrimID[0];
                      }
                      else {
                        auVar64 = vshufps_avx(auVar264,auVar264,0x55);
                        auVar264 = vshufps_avx(auVar264,auVar264,0xaa);
                        local_248[0] = (RTCHitN)auVar64[0];
                        local_248[1] = (RTCHitN)auVar64[1];
                        local_248[2] = (RTCHitN)auVar64[2];
                        local_248[3] = (RTCHitN)auVar64[3];
                        local_248[4] = (RTCHitN)auVar64[4];
                        local_248[5] = (RTCHitN)auVar64[5];
                        local_248[6] = (RTCHitN)auVar64[6];
                        local_248[7] = (RTCHitN)auVar64[7];
                        local_248[8] = (RTCHitN)auVar64[8];
                        local_248[9] = (RTCHitN)auVar64[9];
                        local_248[10] = (RTCHitN)auVar64[10];
                        local_248[0xb] = (RTCHitN)auVar64[0xb];
                        local_248[0xc] = (RTCHitN)auVar64[0xc];
                        local_248[0xd] = (RTCHitN)auVar64[0xd];
                        local_248[0xe] = (RTCHitN)auVar64[0xe];
                        local_248[0xf] = (RTCHitN)auVar64[0xf];
                        local_238 = auVar264;
                        uStack_224 = local_228;
                        uStack_220 = local_228;
                        uStack_21c = local_228;
                        fStack_214 = local_218;
                        fStack_210 = local_218;
                        fStack_20c = local_218;
                        local_208 = auVar68;
                        local_1f8 = CONCAT44(uStack_3c4,local_3c8);
                        uStack_1f0 = CONCAT44(uStack_3bc,uStack_3c0);
                        local_1e8._4_4_ = uStack_3b4;
                        local_1e8._0_4_ = local_3b8;
                        local_1e8._8_4_ = uStack_3b0;
                        local_1e8._12_4_ = uStack_3ac;
                        vpcmpeqd_avx2(ZEXT1632(local_1e8),ZEXT1632(local_1e8));
                        uStack_1d4 = context->user->instID[0];
                        local_1d8 = uStack_1d4;
                        uStack_1d0 = uStack_1d4;
                        uStack_1cc = uStack_1d4;
                        uStack_1c8 = context->user->instPrimID[0];
                        uStack_1c4 = uStack_1c8;
                        uStack_1c0 = uStack_1c8;
                        uStack_1bc = uStack_1c8;
                        *(float *)(ray + k * 4 + 0x80) = fVar62;
                        local_558 = *local_540;
                        uStack_550 = local_540[1];
                        local_538.valid = (int *)&local_558;
                        local_538.geometryUserPtr = pGVar4->userPtr;
                        local_538.context = context->user;
                        local_538.hit = local_248;
                        local_538.N = 4;
                        local_538.ray = (RTCRayN *)ray;
                        if (pGVar4->intersectionFilterN != (RTCFilterFunctionN)0x0) {
                          (*pGVar4->intersectionFilterN)(&local_538);
                          auVar91._8_56_ = extraout_var;
                          auVar91._0_8_ = extraout_XMM1_Qa;
                          auVar264 = auVar91._0_16_;
                        }
                        auVar45._8_8_ = uStack_550;
                        auVar45._0_8_ = local_558;
                        if (auVar45 == (undefined1  [16])0x0) {
                          auVar68 = vpcmpeqd_avx((undefined1  [16])0x0,_DAT_01feba10);
                          auVar264 = vpcmpeqd_avx(auVar264,auVar264);
                          auVar68 = auVar68 ^ auVar264;
                        }
                        else {
                          p_Var5 = context->args->filter;
                          auVar264 = vpcmpeqd_avx(auVar68,auVar68);
                          if ((p_Var5 != (RTCFilterFunctionN)0x0) &&
                             (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                               RTC_RAY_QUERY_FLAG_INCOHERENT ||
                              (((pGVar4->field_8).field_0x2 & 0x40) != 0)))) {
                            (*p_Var5)(&local_538);
                            auVar264 = vpcmpeqd_avx(auVar264,auVar264);
                          }
                          auVar46._8_8_ = uStack_550;
                          auVar46._0_8_ = local_558;
                          auVar64 = vpcmpeqd_avx(auVar46,_DAT_01feba10);
                          auVar68 = auVar64 ^ auVar264;
                          if (auVar46 != (undefined1  [16])0x0) {
                            auVar64 = auVar64 ^ auVar264;
                            auVar264 = vmaskmovps_avx(auVar64,*(undefined1 (*) [16])local_538.hit);
                            *(undefined1 (*) [16])(local_538.ray + 0xc0) = auVar264;
                            auVar264 = vmaskmovps_avx(auVar64,*(undefined1 (*) [16])
                                                               (local_538.hit + 0x10));
                            *(undefined1 (*) [16])(local_538.ray + 0xd0) = auVar264;
                            auVar264 = vmaskmovps_avx(auVar64,*(undefined1 (*) [16])
                                                               (local_538.hit + 0x20));
                            *(undefined1 (*) [16])(local_538.ray + 0xe0) = auVar264;
                            auVar264 = vmaskmovps_avx(auVar64,*(undefined1 (*) [16])
                                                               (local_538.hit + 0x30));
                            *(undefined1 (*) [16])(local_538.ray + 0xf0) = auVar264;
                            auVar264 = vmaskmovps_avx(auVar64,*(undefined1 (*) [16])
                                                               (local_538.hit + 0x40));
                            *(undefined1 (*) [16])(local_538.ray + 0x100) = auVar264;
                            auVar264 = vmaskmovps_avx(auVar64,*(undefined1 (*) [16])
                                                               (local_538.hit + 0x50));
                            *(undefined1 (*) [16])(local_538.ray + 0x110) = auVar264;
                            auVar264 = vmaskmovps_avx(auVar64,*(undefined1 (*) [16])
                                                               (local_538.hit + 0x60));
                            *(undefined1 (*) [16])(local_538.ray + 0x120) = auVar264;
                            auVar264 = vmaskmovps_avx(auVar64,*(undefined1 (*) [16])
                                                               (local_538.hit + 0x70));
                            *(undefined1 (*) [16])(local_538.ray + 0x130) = auVar264;
                            auVar264 = vmaskmovps_avx(auVar64,*(undefined1 (*) [16])
                                                               (local_538.hit + 0x80));
                            *(undefined1 (*) [16])(local_538.ray + 0x140) = auVar264;
                          }
                        }
                        auVar88._8_8_ = 0x100000001;
                        auVar88._0_8_ = 0x100000001;
                        if ((auVar88 & auVar68) == (undefined1  [16])0x0) {
                          *(float *)(ray + k * 4 + 0x80) = fVar148;
                        }
                      }
                    }
                  }
                }
                break;
              }
              lVar55 = lVar55 + -1;
            } while (lVar55 != 0);
          }
          else {
            bVar42 = false;
          }
        }
      }
    } while (bVar42);
    local_358 = vinsertps_avx(auVar8,ZEXT416((uint)fVar145),0x10);
  } while( true );
}

Assistant:

static __forceinline void intersect_n(Precalculations& pre, RayHitK<K>& ray, const size_t k, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,k,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(normal.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);

          unsigned int vertexID = geom->curve(primID);
          Vec3ff a0,a1,a2,a3; Vec3fa n0,n1,n2,n3; geom->gather(a0,a1,a2,a3,n0,n1,n2,n3,vertexID);

          size_t mask1 = mask;
          const size_t i1 = bscf(mask1);
          if (mask) {
            const unsigned int primID1 = prim.primID(N)[i1];
            geom->prefetchL1_vertices(geom->curve(primID1));
            if (mask1) {
              const size_t i2 = bsf(mask1);
              const unsigned int primID2 = prim.primID(N)[i2];
              geom->prefetchL2_vertices(geom->curve(primID2));
            }
          }

          Intersector().intersect(pre,ray,k,context,geom,primID,a0,a1,a2,a3,n0,n1,n2,n3,Epilog(ray,k,context,geomID,primID));
          mask &= movemask(tNear <= vfloat<M>(ray.tfar[k]));
        }
      }